

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersectorK<4,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int iVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 (*pauVar85) [32];
  uint uVar86;
  uint uVar87;
  uint uVar88;
  ulong uVar89;
  ulong uVar90;
  bool bVar91;
  int iVar92;
  ulong uVar93;
  bool bVar94;
  byte bVar95;
  float fVar96;
  float fVar126;
  float fVar128;
  vint4 bi_2;
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined4 uVar97;
  float fVar98;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar114 [32];
  float fVar127;
  float fVar129;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar112 [16];
  undefined1 auVar125 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar147 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar137 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  float fVar152;
  float fVar180;
  float fVar181;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar182;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar161 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar169 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  vint4 ai_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar192 [16];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar215;
  float fVar218;
  vint4 ai;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar221;
  undefined1 auVar211 [32];
  float fVar216;
  float fVar219;
  float fVar222;
  undefined1 auVar212 [32];
  float fVar217;
  float fVar220;
  float fVar223;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  vint4 bi;
  undefined1 auVar242 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [28];
  undefined1 auVar236 [32];
  undefined1 auVar243 [32];
  undefined1 auVar240 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar244 [32];
  undefined1 auVar241 [16];
  undefined1 auVar245 [64];
  vint4 ai_1;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar260;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar261;
  float fVar266;
  float fVar267;
  undefined1 auVar262 [16];
  float fVar268;
  undefined1 auVar264 [32];
  undefined1 auVar263 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar265 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar277;
  float fVar278;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c14;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  Primitive *local_8b8;
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined4 local_860;
  undefined4 uStack_85c;
  undefined4 uStack_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  uint local_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined4 local_740;
  undefined4 uStack_73c;
  undefined4 uStack_738;
  undefined4 uStack_734;
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined1 local_700 [16];
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint uStack_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint uStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar237 [16];
  undefined1 auVar276 [64];
  undefined1 auVar282 [64];
  undefined1 auVar287 [64];
  
  PVar2 = prim[1];
  uVar93 = (ulong)(byte)PVar2;
  lVar25 = uVar93 * 0x19;
  fVar96 = *(float *)(prim + lVar25 + 0x12);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + lVar25 + 6));
  auVar99._0_4_ = fVar96 * auVar5._0_4_;
  auVar99._4_4_ = fVar96 * auVar5._4_4_;
  auVar99._8_4_ = fVar96 * auVar5._8_4_;
  auVar99._12_4_ = fVar96 * auVar5._12_4_;
  auVar224._0_4_ = fVar96 * auVar6._0_4_;
  auVar224._4_4_ = fVar96 * auVar6._4_4_;
  auVar224._8_4_ = fVar96 * auVar6._8_4_;
  auVar224._12_4_ = fVar96 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar93 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar90 = (ulong)(uint)((int)(uVar93 * 9) * 2);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + uVar93 + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  uVar90 = (ulong)(uint)((int)(uVar93 * 5) << 2);
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar90 + 6)));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar292._4_4_ = auVar224._0_4_;
  auVar292._0_4_ = auVar224._0_4_;
  auVar292._8_4_ = auVar224._0_4_;
  auVar292._12_4_ = auVar224._0_4_;
  auVar108 = vshufps_avx(auVar224,auVar224,0x55);
  auVar103 = vshufps_avx(auVar224,auVar224,0xaa);
  fVar96 = auVar103._0_4_;
  auVar279._0_4_ = fVar96 * auVar8._0_4_;
  fVar126 = auVar103._4_4_;
  auVar279._4_4_ = fVar126 * auVar8._4_4_;
  fVar201 = auVar103._8_4_;
  auVar279._8_4_ = fVar201 * auVar8._8_4_;
  fVar215 = auVar103._12_4_;
  auVar279._12_4_ = fVar215 * auVar8._12_4_;
  auVar272._0_4_ = auVar11._0_4_ * fVar96;
  auVar272._4_4_ = auVar11._4_4_ * fVar126;
  auVar272._8_4_ = auVar11._8_4_ * fVar201;
  auVar272._12_4_ = auVar11._12_4_ * fVar215;
  auVar246._0_4_ = auVar153._0_4_ * fVar96;
  auVar246._4_4_ = auVar153._4_4_ * fVar126;
  auVar246._8_4_ = auVar153._8_4_ * fVar201;
  auVar246._12_4_ = auVar153._12_4_ * fVar215;
  auVar103 = vfmadd231ps_fma(auVar279,auVar108,auVar6);
  auVar134 = vfmadd231ps_fma(auVar272,auVar108,auVar10);
  auVar108 = vfmadd231ps_fma(auVar246,auVar100,auVar108);
  auVar165 = vfmadd231ps_fma(auVar103,auVar292,auVar5);
  auVar134 = vfmadd231ps_fma(auVar134,auVar292,auVar9);
  auVar202 = vfmadd231ps_fma(auVar108,auVar101,auVar292);
  auVar293._4_4_ = auVar99._0_4_;
  auVar293._0_4_ = auVar99._0_4_;
  auVar293._8_4_ = auVar99._0_4_;
  auVar293._12_4_ = auVar99._0_4_;
  auVar108 = vshufps_avx(auVar99,auVar99,0x55);
  auVar103 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar96 = auVar103._0_4_;
  auVar225._0_4_ = fVar96 * auVar8._0_4_;
  fVar126 = auVar103._4_4_;
  auVar225._4_4_ = fVar126 * auVar8._4_4_;
  fVar201 = auVar103._8_4_;
  auVar225._8_4_ = fVar201 * auVar8._8_4_;
  fVar215 = auVar103._12_4_;
  auVar225._12_4_ = fVar215 * auVar8._12_4_;
  auVar133._0_4_ = auVar11._0_4_ * fVar96;
  auVar133._4_4_ = auVar11._4_4_ * fVar126;
  auVar133._8_4_ = auVar11._8_4_ * fVar201;
  auVar133._12_4_ = auVar11._12_4_ * fVar215;
  auVar103._0_4_ = auVar153._0_4_ * fVar96;
  auVar103._4_4_ = auVar153._4_4_ * fVar126;
  auVar103._8_4_ = auVar153._8_4_ * fVar201;
  auVar103._12_4_ = auVar153._12_4_ * fVar215;
  auVar6 = vfmadd231ps_fma(auVar225,auVar108,auVar6);
  auVar8 = vfmadd231ps_fma(auVar133,auVar108,auVar10);
  auVar10 = vfmadd231ps_fma(auVar103,auVar108,auVar100);
  auVar11 = vfmadd231ps_fma(auVar6,auVar293,auVar5);
  auVar100 = vfmadd231ps_fma(auVar8,auVar293,auVar9);
  auVar153 = vfmadd231ps_fma(auVar10,auVar293,auVar101);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar165,auVar238);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar157,1);
  auVar6 = vblendvps_avx(auVar165,auVar157,auVar5);
  auVar5 = vandps_avx(auVar134,auVar238);
  auVar5 = vcmpps_avx(auVar5,auVar157,1);
  auVar8 = vblendvps_avx(auVar134,auVar157,auVar5);
  auVar5 = vandps_avx(auVar202,auVar238);
  auVar5 = vcmpps_avx(auVar5,auVar157,1);
  auVar5 = vblendvps_avx(auVar202,auVar157,auVar5);
  auVar9 = vrcpps_avx(auVar6);
  auVar239._8_4_ = 0x3f800000;
  auVar239._0_8_ = 0x3f8000003f800000;
  auVar239._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar9,auVar239);
  auVar9 = vfmadd132ps_fma(auVar6,auVar9,auVar9);
  auVar6 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar6,auVar239);
  auVar10 = vfmadd132ps_fma(auVar8,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar239);
  auVar101 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar93 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar11);
  auVar202._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar202._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar202._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar202._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar93 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar11);
  auVar226._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar226._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar226._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar226._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar134._1_3_ = 0;
  auVar134[0] = PVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar93 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar100);
  auVar247._0_4_ = auVar5._0_4_ * auVar10._0_4_;
  auVar247._4_4_ = auVar5._4_4_ * auVar10._4_4_;
  auVar247._8_4_ = auVar5._8_4_ * auVar10._8_4_;
  auVar247._12_4_ = auVar5._12_4_ * auVar10._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar100);
  auVar108._0_4_ = auVar10._0_4_ * auVar5._0_4_;
  auVar108._4_4_ = auVar10._4_4_ * auVar5._4_4_;
  auVar108._8_4_ = auVar10._8_4_ * auVar5._8_4_;
  auVar108._12_4_ = auVar10._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar90 + uVar93 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar153);
  auVar165._0_4_ = auVar101._0_4_ * auVar5._0_4_;
  auVar165._4_4_ = auVar101._4_4_ * auVar5._4_4_;
  auVar165._8_4_ = auVar101._8_4_ * auVar5._8_4_;
  auVar165._12_4_ = auVar101._12_4_ * auVar5._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar93 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar11);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar153);
  auVar100._0_4_ = auVar101._0_4_ * auVar5._0_4_;
  auVar100._4_4_ = auVar101._4_4_ * auVar5._4_4_;
  auVar100._8_4_ = auVar101._8_4_ * auVar5._8_4_;
  auVar100._12_4_ = auVar101._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar202,auVar226);
  auVar6 = vpminsd_avx(auVar247,auVar108);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar165,auVar100);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar262._4_4_ = uVar97;
  auVar262._0_4_ = uVar97;
  auVar262._8_4_ = uVar97;
  auVar262._12_4_ = uVar97;
  auVar6 = vmaxps_avx(auVar6,auVar262);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_5a0._0_4_ = auVar5._0_4_ * 0.99999964;
  local_5a0._4_4_ = auVar5._4_4_ * 0.99999964;
  local_5a0._8_4_ = auVar5._8_4_ * 0.99999964;
  local_5a0._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar202,auVar226);
  auVar6 = vpmaxsd_avx(auVar247,auVar108);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar165,auVar100);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar153._4_4_ = uVar97;
  auVar153._0_4_ = uVar97;
  auVar153._8_4_ = uVar97;
  auVar153._12_4_ = uVar97;
  auVar6 = vminps_avx(auVar6,auVar153);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar101._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar101._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar101._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar101._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar134[4] = PVar2;
  auVar134._5_3_ = 0;
  auVar134[8] = PVar2;
  auVar134._9_3_ = 0;
  auVar134[0xc] = PVar2;
  auVar134._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar134,_DAT_01f7fcf0);
  auVar5 = vcmpps_avx(local_5a0,auVar101,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar88 = vmovmskps_avx(auVar5);
  if (uVar88 == 0) {
    return false;
  }
  uVar88 = uVar88 & 0xff;
  auVar114._16_16_ = mm_lookupmask_ps._240_16_;
  auVar114._0_16_ = mm_lookupmask_ps._240_16_;
  local_8b8 = prim + lVar25 + 0x16;
  local_2e0 = vblendps_avx(auVar114,ZEXT832(0) << 0x20,0x80);
  local_860 = 0x7fffffff;
  uStack_85c = 0x7fffffff;
  uStack_858 = 0x7fffffff;
  uStack_854 = 0x7fffffff;
  uStack_850 = 0x7fffffff;
  uStack_84c = 0x7fffffff;
  uStack_848 = 0x7fffffff;
  uStack_844 = 0x7fffffff;
  local_680 = 0x80000000;
  uStack_67c = 0x80000000;
  uStack_678 = 0x80000000;
  uStack_674 = 0x80000000;
  fStack_670 = -0.0;
  fStack_66c = -0.0;
  fStack_668 = -0.0;
  uStack_664 = 0x80000000;
  local_8b0 = prim;
LAB_015b7346:
  lVar25 = 0;
  local_8a8 = (ulong)uVar88;
  for (uVar93 = local_8a8; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  local_8a8 = local_8a8 - 1 & local_8a8;
  local_780 = *(undefined4 *)(local_8b0 + lVar25 * 4 + 6);
  uVar93 = (ulong)(uint)((int)lVar25 << 6);
  auVar5 = *(undefined1 (*) [16])(local_8b8 + uVar93);
  if (local_8a8 != 0) {
    uVar89 = local_8a8 - 1 & local_8a8;
    for (uVar90 = local_8a8; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x8000000000000000) {
    }
    if (uVar89 != 0) {
      for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = *(undefined1 (*) [16])(local_8b8 + uVar93 + 0x10);
  auVar8 = *(undefined1 (*) [16])(local_8b8 + uVar93 + 0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar11 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar273._4_4_ = uVar97;
  auVar273._0_4_ = uVar97;
  auVar273._8_4_ = uVar97;
  auVar273._12_4_ = uVar97;
  fStack_810 = (float)uVar97;
  _local_820 = auVar273;
  fStack_80c = (float)uVar97;
  fStack_808 = (float)uVar97;
  register0x0000149c = uVar97;
  auVar276 = ZEXT3264(_local_820);
  auVar9 = *(undefined1 (*) [16])(local_8b8 + uVar93 + 0x30);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar280._4_4_ = uVar97;
  auVar280._0_4_ = uVar97;
  auVar280._8_4_ = uVar97;
  auVar280._12_4_ = uVar97;
  fStack_a50 = (float)uVar97;
  _local_a60 = auVar280;
  fStack_a4c = (float)uVar97;
  fStack_a48 = (float)uVar97;
  register0x000014dc = uVar97;
  auVar282 = ZEXT3264(_local_a60);
  auVar10 = vunpcklps_avx(auVar273,auVar280);
  fVar96 = *(float *)(ray + k * 4 + 0x60);
  auVar283._4_4_ = fVar96;
  auVar283._0_4_ = fVar96;
  auVar283._8_4_ = fVar96;
  auVar283._12_4_ = fVar96;
  fStack_970 = fVar96;
  _local_980 = auVar283;
  fStack_96c = fVar96;
  fStack_968 = fVar96;
  register0x0000151c = fVar96;
  auVar287 = ZEXT3264(_local_980);
  local_9b0 = vinsertps_avx(auVar10,auVar283,0x28);
  auVar227._0_4_ = (auVar5._0_4_ + auVar6._0_4_ + auVar8._0_4_ + auVar9._0_4_) * 0.25;
  auVar227._4_4_ = (auVar5._4_4_ + auVar6._4_4_ + auVar8._4_4_ + auVar9._4_4_) * 0.25;
  auVar227._8_4_ = (auVar5._8_4_ + auVar6._8_4_ + auVar8._8_4_ + auVar9._8_4_) * 0.25;
  auVar227._12_4_ = (auVar5._12_4_ + auVar6._12_4_ + auVar8._12_4_ + auVar9._12_4_) * 0.25;
  auVar10 = vsubps_avx(auVar227,auVar11);
  auVar10 = vdpps_avx(auVar10,local_9b0,0x7f);
  local_9c0 = vdpps_avx(local_9b0,local_9b0,0x7f);
  auVar265 = ZEXT1664(local_9c0);
  uVar88 = *(uint *)(local_8b0 + 2);
  auVar101 = vrcpss_avx(local_9c0,local_9c0);
  auVar100 = vfnmadd213ss_fma(auVar101,local_9c0,ZEXT416(0x40000000));
  local_300 = auVar10._0_4_ * auVar101._0_4_ * auVar100._0_4_;
  auVar234._4_4_ = local_300;
  auVar234._0_4_ = local_300;
  auVar234._8_4_ = local_300;
  auVar234._12_4_ = local_300;
  fStack_910 = local_300;
  _local_920 = auVar234;
  fStack_90c = local_300;
  fStack_908 = local_300;
  fStack_904 = local_300;
  auVar10 = vfmadd231ps_fma(auVar11,local_9b0,auVar234);
  auVar10 = vblendps_avx(auVar10,_DAT_01f7aa10,8);
  auVar11 = vsubps_avx(auVar5,auVar10);
  auVar8 = vsubps_avx(auVar8,auVar10);
  auVar101 = vsubps_avx(auVar6,auVar10);
  auVar9 = vsubps_avx(auVar9,auVar10);
  auVar5 = vmovshdup_avx(auVar11);
  local_420 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar11,auVar11,0xaa);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar11,auVar11,0xff);
  local_440 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar101);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vshufps_avx(auVar101,auVar101,0xaa);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vshufps_avx(auVar101,auVar101,0xff);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vmovshdup_avx(auVar8);
  local_460 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_480 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_4a0 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar9);
  local_4c0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  local_4e0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_500 = auVar5._0_8_;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar96 * fVar96)),_local_a60,_local_a60);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_820,_local_820);
  uVar97 = auVar5._0_4_;
  local_260._4_4_ = uVar97;
  local_260._0_4_ = uVar97;
  local_260._8_4_ = uVar97;
  local_260._12_4_ = uVar97;
  local_260._16_4_ = uVar97;
  local_260._20_4_ = uVar97;
  local_260._24_4_ = uVar97;
  local_260._28_4_ = uVar97;
  auVar245 = ZEXT3264(local_260);
  fVar96 = *(float *)(ray + k * 4 + 0x30);
  local_8e0 = ZEXT416((uint)local_300);
  local_300 = fVar96 - local_300;
  fStack_2fc = local_300;
  fStack_2f8 = local_300;
  fStack_2f4 = local_300;
  fStack_2f0 = local_300;
  fStack_2ec = local_300;
  fStack_2e8 = local_300;
  fStack_2e4 = local_300;
  local_c14 = 1;
  uVar93 = 0;
  bVar91 = false;
  local_520 = auVar11._0_4_;
  local_280 = auVar101._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_540 = auVar8._0_4_;
  fVar126 = auVar9._0_4_;
  auVar147._4_4_ = uStack_85c;
  auVar147._0_4_ = local_860;
  auVar147._8_4_ = uStack_858;
  auVar147._12_4_ = uStack_854;
  auVar147._16_4_ = uStack_850;
  auVar147._20_4_ = uStack_84c;
  auVar147._24_4_ = uStack_848;
  auVar147._28_4_ = uStack_844;
  local_580 = vandps_avx(local_260,auVar147);
  auVar5 = vsqrtss_avx(local_9c0,local_9c0);
  auVar6 = vsqrtss_avx(local_9c0,local_9c0);
  local_590 = ZEXT816(0x3f80000000000000);
  uStack_77c = local_780;
  uStack_778 = local_780;
  uStack_774 = local_780;
  local_770 = uVar88;
  uStack_76c = uVar88;
  uStack_768 = uVar88;
  uStack_764 = uVar88;
  local_560 = fVar126;
  fStack_55c = fVar126;
  fStack_558 = fVar126;
  fStack_554 = fVar126;
  fStack_550 = fVar126;
  fStack_54c = fVar126;
  fStack_548 = fVar126;
  fStack_544 = fVar126;
  uStack_53c = local_540;
  uStack_538 = local_540;
  uStack_534 = local_540;
  uStack_530 = local_540;
  uStack_52c = local_540;
  uStack_528 = local_540;
  uStack_524 = local_540;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  do {
    auVar193._8_4_ = 0x3f800000;
    auVar193._0_8_ = 0x3f8000003f800000;
    auVar193._12_4_ = 0x3f800000;
    auVar193._16_4_ = 0x3f800000;
    auVar193._20_4_ = 0x3f800000;
    iVar92 = (int)uVar93;
    auVar193._24_4_ = 0x3f800000;
    auVar193._28_4_ = 0x3f800000;
    auVar10 = vmovshdup_avx(local_590);
    auVar10 = vsubps_avx(auVar10,local_590);
    local_7c0._0_4_ = auVar10._0_4_;
    fVar222 = (float)local_7c0._0_4_ * 0.04761905;
    uVar97 = local_590._0_4_;
    local_940._4_4_ = uVar97;
    local_940._0_4_ = uVar97;
    local_940._8_4_ = uVar97;
    local_940._12_4_ = uVar97;
    local_940._16_4_ = uVar97;
    local_940._20_4_ = uVar97;
    local_940._24_4_ = uVar97;
    local_940._28_4_ = uVar97;
    local_7c0._4_4_ = local_7c0._0_4_;
    local_7c0._8_4_ = local_7c0._0_4_;
    local_7c0._12_4_ = local_7c0._0_4_;
    local_7c0._16_4_ = local_7c0._0_4_;
    local_7c0._20_4_ = local_7c0._0_4_;
    local_7c0._24_4_ = local_7c0._0_4_;
    local_7c0._28_4_ = local_7c0._0_4_;
    auVar10 = vfmadd231ps_fma(local_940,local_7c0,_DAT_01faff20);
    auVar114 = vsubps_avx(auVar193,ZEXT1632(auVar10));
    fVar201 = auVar114._0_4_;
    fVar218 = auVar114._4_4_;
    fVar217 = auVar114._8_4_;
    fVar260 = auVar114._12_4_;
    fVar219 = auVar114._16_4_;
    fVar278 = auVar114._20_4_;
    fVar223 = auVar114._24_4_;
    fVar98 = fVar201 * fVar201 * fVar201;
    fVar127 = fVar218 * fVar218 * fVar218;
    fVar128 = fVar217 * fVar217 * fVar217;
    fVar129 = fVar260 * fVar260 * fVar260;
    fVar130 = fVar219 * fVar219 * fVar219;
    fVar131 = fVar278 * fVar278 * fVar278;
    fVar132 = fVar223 * fVar223 * fVar223;
    fVar215 = auVar10._0_4_;
    fVar221 = auVar10._4_4_;
    fVar216 = auVar10._8_4_;
    fVar220 = auVar10._12_4_;
    fVar152 = fVar215 * fVar215 * fVar215;
    fVar180 = fVar221 * fVar221 * fVar221;
    fVar181 = fVar216 * fVar216 * fVar216;
    fVar182 = fVar220 * fVar220 * fVar220;
    fVar261 = fVar201 * fVar215;
    fVar266 = fVar218 * fVar221;
    fVar267 = fVar217 * fVar216;
    fVar268 = fVar260 * fVar220;
    fVar269 = fVar219 * 0.0;
    fVar270 = fVar278 * 0.0;
    fVar271 = fVar223 * 0.0;
    fVar277 = auVar276._28_4_ + auVar287._28_4_;
    auVar7._4_4_ = fVar127 * 0.16666667;
    auVar7._0_4_ = fVar98 * 0.16666667;
    auVar7._8_4_ = fVar128 * 0.16666667;
    auVar7._12_4_ = fVar129 * 0.16666667;
    auVar7._16_4_ = fVar130 * 0.16666667;
    auVar7._20_4_ = fVar131 * 0.16666667;
    auVar7._24_4_ = fVar132 * 0.16666667;
    auVar7._28_4_ = fVar277 + (float)local_7c0._0_4_;
    auVar13._4_4_ =
         (fVar218 * fVar266 * 12.0 + fVar266 * fVar221 * 6.0 + fVar180 + fVar127 * 4.0) * 0.16666667
    ;
    auVar13._0_4_ =
         (fVar201 * fVar261 * 12.0 + fVar261 * fVar215 * 6.0 + fVar152 + fVar98 * 4.0) * 0.16666667;
    auVar13._8_4_ =
         (fVar217 * fVar267 * 12.0 + fVar267 * fVar216 * 6.0 + fVar181 + fVar128 * 4.0) * 0.16666667
    ;
    auVar13._12_4_ =
         (fVar260 * fVar268 * 12.0 + fVar268 * fVar220 * 6.0 + fVar182 + fVar129 * 4.0) * 0.16666667
    ;
    auVar13._16_4_ =
         (fVar219 * fVar269 * 12.0 + fVar269 * 0.0 * 6.0 + fVar130 * 4.0 + 0.0) * 0.16666667;
    auVar13._20_4_ =
         (fVar278 * fVar270 * 12.0 + fVar270 * 0.0 * 6.0 + fVar131 * 4.0 + 0.0) * 0.16666667;
    auVar13._24_4_ =
         (fVar223 * fVar271 * 12.0 + fVar271 * 0.0 * 6.0 + fVar132 * 4.0 + 0.0) * 0.16666667;
    auVar13._28_4_ = auVar282._28_4_;
    auVar15._4_4_ =
         (fVar180 * 4.0 + fVar127 + fVar266 * fVar221 * 12.0 + fVar218 * fVar266 * 6.0) * 0.16666667
    ;
    auVar15._0_4_ =
         (fVar152 * 4.0 + fVar98 + fVar261 * fVar215 * 12.0 + fVar201 * fVar261 * 6.0) * 0.16666667;
    auVar15._8_4_ =
         (fVar181 * 4.0 + fVar128 + fVar267 * fVar216 * 12.0 + fVar217 * fVar267 * 6.0) * 0.16666667
    ;
    auVar15._12_4_ =
         (fVar182 * 4.0 + fVar129 + fVar268 * fVar220 * 12.0 + fVar260 * fVar268 * 6.0) * 0.16666667
    ;
    auVar15._16_4_ = (fVar130 + 0.0 + fVar269 * 0.0 * 12.0 + fVar219 * fVar269 * 6.0) * 0.16666667;
    auVar15._20_4_ = (fVar131 + 0.0 + fVar270 * 0.0 * 12.0 + fVar278 * fVar270 * 6.0) * 0.16666667;
    auVar15._24_4_ = (fVar132 + 0.0 + fVar271 * 0.0 * 12.0 + fVar223 * fVar271 * 6.0) * 0.16666667;
    auVar15._28_4_ = auVar287._28_4_;
    fVar152 = fVar152 * 0.16666667;
    fVar180 = fVar180 * 0.16666667;
    fVar181 = fVar181 * 0.16666667;
    fVar182 = fVar182 * 0.16666667;
    auVar119._4_4_ = fVar180 * fStack_55c;
    auVar119._0_4_ = fVar152 * local_560;
    auVar119._8_4_ = fVar181 * fStack_558;
    auVar119._12_4_ = fVar182 * fStack_554;
    auVar119._16_4_ = fStack_550 * 0.0;
    auVar119._20_4_ = fStack_54c * 0.0;
    auVar119._24_4_ = fStack_548 * 0.0;
    auVar119._28_4_ = local_7c0._0_4_;
    auVar16._4_4_ = fVar180 * local_4c0._4_4_;
    auVar16._0_4_ = fVar152 * (float)local_4c0;
    auVar16._8_4_ = fVar181 * (float)uStack_4b8;
    auVar16._12_4_ = fVar182 * uStack_4b8._4_4_;
    auVar16._16_4_ = (float)uStack_4b0 * 0.0;
    auVar16._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar16._24_4_ = (float)uStack_4a8 * 0.0;
    auVar16._28_4_ = fVar277 + DAT_01faff20._28_4_ + 0.0;
    auVar256._4_4_ = fVar180 * local_4e0._4_4_;
    auVar256._0_4_ = fVar152 * (float)local_4e0;
    auVar256._8_4_ = fVar181 * (float)uStack_4d8;
    auVar256._12_4_ = fVar182 * uStack_4d8._4_4_;
    auVar256._16_4_ = (float)uStack_4d0 * 0.0;
    auVar256._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar256._24_4_ = (float)uStack_4c8 * 0.0;
    auVar256._28_4_ = 0;
    auVar17._4_4_ = fVar180 * local_500._4_4_;
    auVar17._0_4_ = fVar152 * (float)local_500;
    auVar17._8_4_ = fVar181 * (float)uStack_4f8;
    auVar17._12_4_ = fVar182 * uStack_4f8._4_4_;
    auVar17._16_4_ = (float)uStack_4f0 * 0.0;
    auVar17._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_4e8 * 0.0;
    auVar17._28_4_ = 0x40c00000;
    auVar115._4_4_ = uStack_53c;
    auVar115._0_4_ = local_540;
    auVar115._8_4_ = uStack_538;
    auVar115._12_4_ = uStack_534;
    auVar115._16_4_ = uStack_530;
    auVar115._20_4_ = uStack_52c;
    auVar115._24_4_ = uStack_528;
    auVar115._28_4_ = uStack_524;
    auVar10 = vfmadd231ps_fma(auVar119,auVar15,auVar115);
    auVar70._8_8_ = uStack_458;
    auVar70._0_8_ = local_460;
    auVar70._16_8_ = uStack_450;
    auVar70._24_8_ = uStack_448;
    auVar100 = vfmadd231ps_fma(auVar16,auVar15,auVar70);
    auVar68._8_8_ = uStack_478;
    auVar68._0_8_ = local_480;
    auVar68._16_8_ = uStack_470;
    auVar68._24_8_ = uStack_468;
    auVar153 = vfmadd231ps_fma(auVar256,auVar15,auVar68);
    auVar66._8_8_ = uStack_498;
    auVar66._0_8_ = local_4a0;
    auVar66._16_8_ = uStack_490;
    auVar66._24_8_ = uStack_488;
    auVar108 = vfmadd231ps_fma(auVar17,auVar15,auVar66);
    auVar79._4_4_ = uStack_27c;
    auVar79._0_4_ = local_280;
    auVar79._8_4_ = uStack_278;
    auVar79._12_4_ = uStack_274;
    auVar79._16_4_ = uStack_270;
    auVar79._20_4_ = uStack_26c;
    auVar79._24_4_ = uStack_268;
    auVar79._28_4_ = uStack_264;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar13,auVar79);
    auVar82._8_8_ = uStack_1f8;
    auVar82._0_8_ = local_200;
    auVar82._16_8_ = uStack_1f0;
    auVar82._24_8_ = uStack_1e8;
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar13,auVar82);
    auVar81._8_8_ = uStack_218;
    auVar81._0_8_ = local_220;
    auVar81._16_8_ = uStack_210;
    auVar81._24_8_ = uStack_208;
    auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar13,auVar81);
    auVar80._8_8_ = uStack_238;
    auVar80._0_8_ = local_240;
    auVar80._16_8_ = uStack_230;
    auVar80._24_8_ = uStack_228;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar80,auVar13);
    auVar64._4_4_ = uStack_51c;
    auVar64._0_4_ = local_520;
    auVar64._8_4_ = uStack_518;
    auVar64._12_4_ = uStack_514;
    auVar64._16_4_ = uStack_510;
    auVar64._20_4_ = uStack_50c;
    auVar64._24_4_ = uStack_508;
    auVar64._28_4_ = uStack_504;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar7,auVar64);
    auVar115 = ZEXT1632(auVar10);
    auVar74._8_8_ = uStack_418;
    auVar74._0_8_ = local_420;
    auVar74._16_8_ = uStack_410;
    auVar74._24_8_ = uStack_408;
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar7,auVar74);
    local_960 = ZEXT1632(auVar100);
    auVar83._8_8_ = uStack_1d8;
    auVar83._0_8_ = local_1e0;
    auVar83._16_8_ = uStack_1d0;
    auVar83._24_8_ = uStack_1c8;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar7,auVar83);
    auVar72._8_8_ = uStack_438;
    auVar72._0_8_ = local_440;
    auVar72._16_8_ = uStack_430;
    auVar72._24_8_ = uStack_428;
    auVar153 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar7,auVar72);
    auVar236._0_4_ = (float)((uint)fVar215 ^ local_680) * fVar215;
    auVar236._4_4_ = (float)((uint)fVar221 ^ uStack_67c) * fVar221;
    auVar236._8_4_ = (float)((uint)fVar216 ^ uStack_678) * fVar216;
    auVar236._12_4_ = (float)((uint)fVar220 ^ uStack_674) * fVar220;
    auVar236._16_4_ = fStack_670 * 0.0;
    auVar236._20_4_ = fStack_66c * 0.0;
    auVar236._24_4_ = fStack_668 * 0.0;
    auVar236._28_4_ = 0;
    auVar18._4_4_ = fVar266 * 4.0;
    auVar18._0_4_ = fVar261 * 4.0;
    auVar18._8_4_ = fVar267 * 4.0;
    auVar18._12_4_ = fVar268 * 4.0;
    auVar18._16_4_ = fVar269 * 4.0;
    auVar18._20_4_ = fVar270 * 4.0;
    fVar98 = auVar265._28_4_;
    auVar18._24_4_ = fVar271 * 4.0;
    auVar18._28_4_ = fVar98;
    auVar147 = vsubps_avx(auVar236,auVar18);
    auVar19._4_4_ = fVar218 * (float)((uint)fVar218 ^ uStack_67c) * 0.5;
    auVar19._0_4_ = fVar201 * (float)((uint)fVar201 ^ local_680) * 0.5;
    auVar19._8_4_ = fVar217 * (float)((uint)fVar217 ^ uStack_678) * 0.5;
    auVar19._12_4_ = fVar260 * (float)((uint)fVar260 ^ uStack_674) * 0.5;
    auVar19._16_4_ = fVar219 * (float)((uint)fVar219 ^ (uint)fStack_670) * 0.5;
    auVar19._20_4_ = fVar278 * (float)((uint)fVar278 ^ (uint)fStack_66c) * 0.5;
    auVar19._24_4_ = fVar223 * (float)((uint)fVar223 ^ (uint)fStack_668) * 0.5;
    auVar19._28_4_ = auVar114._28_4_;
    auVar20._4_4_ = auVar147._4_4_ * 0.5;
    auVar20._0_4_ = auVar147._0_4_ * 0.5;
    auVar20._8_4_ = auVar147._8_4_ * 0.5;
    auVar20._12_4_ = auVar147._12_4_ * 0.5;
    auVar20._16_4_ = auVar147._16_4_ * 0.5;
    auVar20._20_4_ = auVar147._20_4_ * 0.5;
    auVar20._24_4_ = auVar147._24_4_ * 0.5;
    auVar20._28_4_ = auVar147._28_4_;
    auVar213._4_4_ = (fVar266 * 4.0 + fVar218 * fVar218) * 0.5;
    auVar213._0_4_ = (fVar261 * 4.0 + fVar201 * fVar201) * 0.5;
    auVar213._8_4_ = (fVar267 * 4.0 + fVar217 * fVar217) * 0.5;
    auVar213._12_4_ = (fVar268 * 4.0 + fVar260 * fVar260) * 0.5;
    auVar213._16_4_ = (fVar269 * 4.0 + fVar219 * fVar219) * 0.5;
    auVar213._20_4_ = (fVar270 * 4.0 + fVar278 * fVar278) * 0.5;
    auVar213._24_4_ = (fVar271 * 4.0 + fVar223 * fVar223) * 0.5;
    auVar213._28_4_ = fVar98 + auVar245._28_4_;
    fVar201 = fVar215 * fVar215 * 0.5;
    fVar215 = fVar221 * fVar221 * 0.5;
    fVar218 = fVar216 * fVar216 * 0.5;
    fVar221 = fVar220 * fVar220 * 0.5;
    auVar21._4_4_ = fVar215 * fStack_55c;
    auVar21._0_4_ = fVar201 * local_560;
    auVar21._8_4_ = fVar218 * fStack_558;
    auVar21._12_4_ = fVar221 * fStack_554;
    auVar21._16_4_ = fStack_550 * 0.0;
    auVar21._20_4_ = fStack_54c * 0.0;
    auVar21._24_4_ = fStack_548 * 0.0;
    auVar21._28_4_ = fVar98;
    auVar22._4_4_ = fVar215 * local_4c0._4_4_;
    auVar22._0_4_ = fVar201 * (float)local_4c0;
    auVar22._8_4_ = fVar218 * (float)uStack_4b8;
    auVar22._12_4_ = fVar221 * uStack_4b8._4_4_;
    auVar22._16_4_ = (float)uStack_4b0 * 0.0;
    auVar22._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar22._24_4_ = (float)uStack_4a8 * 0.0;
    auVar22._28_4_ = uStack_664;
    auVar23._4_4_ = fVar215 * local_4e0._4_4_;
    auVar23._0_4_ = fVar201 * (float)local_4e0;
    auVar23._8_4_ = fVar218 * (float)uStack_4d8;
    auVar23._12_4_ = fVar221 * uStack_4d8._4_4_;
    auVar23._16_4_ = (float)uStack_4d0 * 0.0;
    auVar23._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar23._24_4_ = (float)uStack_4c8 * 0.0;
    auVar23._28_4_ = auVar282._28_4_;
    auVar170._4_4_ = fVar215 * local_500._4_4_;
    auVar170._0_4_ = fVar201 * (float)local_500;
    auVar170._8_4_ = fVar218 * (float)uStack_4f8;
    auVar170._12_4_ = fVar221 * uStack_4f8._4_4_;
    auVar170._16_4_ = (float)uStack_4f0 * 0.0;
    auVar170._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar170._24_4_ = (float)uStack_4e8 * 0.0;
    auVar170._28_4_ = 0;
    auVar63._4_4_ = uStack_53c;
    auVar63._0_4_ = local_540;
    auVar63._8_4_ = uStack_538;
    auVar63._12_4_ = uStack_534;
    auVar63._16_4_ = uStack_530;
    auVar63._20_4_ = uStack_52c;
    auVar63._24_4_ = uStack_528;
    auVar63._28_4_ = uStack_524;
    auVar108 = vfmadd231ps_fma(auVar21,auVar213,auVar63);
    auVar71._8_8_ = uStack_458;
    auVar71._0_8_ = local_460;
    auVar71._16_8_ = uStack_450;
    auVar71._24_8_ = uStack_448;
    auVar103 = vfmadd231ps_fma(auVar22,auVar213,auVar71);
    auVar69._8_8_ = uStack_478;
    auVar69._0_8_ = local_480;
    auVar69._16_8_ = uStack_470;
    auVar69._24_8_ = uStack_468;
    auVar134 = vfmadd231ps_fma(auVar23,auVar213,auVar69);
    auVar67._8_8_ = uStack_498;
    auVar67._0_8_ = local_4a0;
    auVar67._16_8_ = uStack_490;
    auVar67._24_8_ = uStack_488;
    auVar165 = vfmadd231ps_fma(auVar170,auVar213,auVar67);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar20,auVar79);
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar20,auVar82);
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar20,auVar81);
    auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar80,auVar20);
    auVar65._4_4_ = uStack_51c;
    auVar65._0_4_ = local_520;
    auVar65._8_4_ = uStack_518;
    auVar65._12_4_ = uStack_514;
    auVar65._16_4_ = uStack_510;
    auVar65._20_4_ = uStack_50c;
    auVar65._24_4_ = uStack_508;
    auVar65._28_4_ = uStack_504;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar19,auVar65);
    auVar75._8_8_ = uStack_418;
    auVar75._0_8_ = local_420;
    auVar75._16_8_ = uStack_410;
    auVar75._24_8_ = uStack_408;
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar19,auVar75);
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),auVar19,auVar83);
    auVar73._8_8_ = uStack_438;
    auVar73._0_8_ = local_440;
    auVar73._16_8_ = uStack_430;
    auVar73._24_8_ = uStack_428;
    auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar19,auVar73);
    auVar264._0_4_ = auVar108._0_4_ * fVar222;
    auVar264._4_4_ = auVar108._4_4_ * fVar222;
    auVar264._8_4_ = auVar108._8_4_ * fVar222;
    auVar264._12_4_ = auVar108._12_4_ * fVar222;
    auVar264._16_4_ = fVar222 * 0.0;
    auVar264._20_4_ = fVar222 * 0.0;
    auVar264._24_4_ = fVar222 * 0.0;
    auVar264._28_4_ = 0;
    fVar201 = auVar103._0_4_ * fVar222;
    fVar215 = auVar103._4_4_ * fVar222;
    local_9e0._4_4_ = fVar215;
    local_9e0._0_4_ = fVar201;
    fVar218 = auVar103._8_4_ * fVar222;
    local_9e0._8_4_ = fVar218;
    fVar221 = auVar103._12_4_ * fVar222;
    local_9e0._12_4_ = fVar221;
    local_9e0._16_4_ = fVar222 * 0.0;
    local_9e0._20_4_ = fVar222 * 0.0;
    local_9e0._24_4_ = fVar222 * 0.0;
    local_9e0._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    fVar132 = auVar134._0_4_ * fVar222;
    fVar152 = auVar134._4_4_ * fVar222;
    auVar281._4_4_ = fVar152;
    auVar281._0_4_ = fVar132;
    fVar180 = auVar134._8_4_ * fVar222;
    auVar281._8_4_ = fVar180;
    fVar181 = auVar134._12_4_ * fVar222;
    auVar281._12_4_ = fVar181;
    fVar182 = fVar222 * 0.0;
    auVar281._16_4_ = fVar182;
    fVar261 = fVar222 * 0.0;
    auVar281._20_4_ = fVar261;
    uVar97 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    fVar266 = fVar222 * 0.0;
    auVar281._24_4_ = fVar266;
    auVar281._28_4_ = uVar97;
    auVar211._0_4_ = fVar222 * auVar165._0_4_;
    auVar211._4_4_ = fVar222 * auVar165._4_4_;
    auVar211._8_4_ = fVar222 * auVar165._8_4_;
    auVar211._12_4_ = fVar222 * auVar165._12_4_;
    auVar211._16_4_ = fVar222 * 0.0;
    auVar211._20_4_ = fVar222 * 0.0;
    auVar211._24_4_ = fVar222 * 0.0;
    auVar211._28_4_ = 0;
    auVar20 = vpermps_avx2(_DAT_01fec480,auVar115);
    auVar213 = vpermps_avx2(_DAT_01fec480,local_960);
    auVar170 = ZEXT1632(auVar10);
    local_7a0 = vpermps_avx2(_DAT_01fec480,auVar170);
    auVar15 = vsubps_avx(auVar20,auVar115);
    auVar119 = vsubps_avx(local_7a0,ZEXT1632(auVar10));
    fVar220 = auVar119._0_4_;
    fVar219 = auVar119._4_4_;
    auVar299._4_4_ = fVar219 * auVar264._4_4_;
    auVar299._0_4_ = fVar220 * auVar264._0_4_;
    fVar223 = auVar119._8_4_;
    auVar299._8_4_ = fVar223 * auVar264._8_4_;
    fVar98 = auVar119._12_4_;
    auVar299._12_4_ = fVar98 * auVar264._12_4_;
    fVar127 = auVar119._16_4_;
    auVar299._16_4_ = fVar127 * auVar264._16_4_;
    fVar128 = auVar119._20_4_;
    auVar299._20_4_ = fVar128 * auVar264._20_4_;
    fVar129 = auVar119._24_4_;
    auVar299._24_4_ = fVar129 * auVar264._24_4_;
    auVar299._28_4_ = auVar20._28_4_;
    auVar10 = vfmsub231ps_fma(auVar299,auVar281,auVar15);
    auVar16 = vsubps_avx(auVar213,local_960);
    fVar270 = auVar15._0_4_;
    fVar271 = auVar15._4_4_;
    auVar242._4_4_ = fVar271 * fVar215;
    auVar242._0_4_ = fVar270 * fVar201;
    fVar277 = auVar15._8_4_;
    auVar242._8_4_ = fVar277 * fVar218;
    fVar294 = auVar15._12_4_;
    auVar242._12_4_ = fVar294 * fVar221;
    fVar295 = auVar15._16_4_;
    auVar242._16_4_ = fVar295 * fVar222 * 0.0;
    fVar296 = auVar15._20_4_;
    auVar242._20_4_ = fVar296 * fVar222 * 0.0;
    fVar297 = auVar15._24_4_;
    auVar242._24_4_ = fVar297 * fVar222 * 0.0;
    auVar242._28_4_ = auVar213._28_4_;
    auVar108 = vfmsub231ps_fma(auVar242,auVar264,auVar16);
    auVar10 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar108._12_4_ * auVar108._12_4_,
                                                 CONCAT48(auVar108._8_4_ * auVar108._8_4_,
                                                          CONCAT44(auVar108._4_4_ * auVar108._4_4_,
                                                                   auVar108._0_4_ * auVar108._0_4_))
                                                )),ZEXT1632(auVar10),ZEXT1632(auVar10));
    fVar278 = auVar16._0_4_;
    fVar222 = auVar16._4_4_;
    auVar12._4_4_ = fVar222 * fVar152;
    auVar12._0_4_ = fVar278 * fVar132;
    fVar130 = auVar16._8_4_;
    auVar12._8_4_ = fVar130 * fVar180;
    fVar131 = auVar16._12_4_;
    auVar12._12_4_ = fVar131 * fVar181;
    fVar267 = auVar16._16_4_;
    auVar12._16_4_ = fVar267 * fVar182;
    fVar268 = auVar16._20_4_;
    auVar12._20_4_ = fVar268 * fVar261;
    fVar269 = auVar16._24_4_;
    auVar12._24_4_ = fVar269 * fVar266;
    auVar12._28_4_ = local_7a0._28_4_;
    auVar103 = vfmsub231ps_fma(auVar12,local_9e0,auVar119);
    auVar194._0_4_ = fVar220 * fVar220;
    auVar194._4_4_ = fVar219 * fVar219;
    auVar194._8_4_ = fVar223 * fVar223;
    auVar194._12_4_ = fVar98 * fVar98;
    auVar194._16_4_ = fVar127 * fVar127;
    auVar194._20_4_ = fVar128 * fVar128;
    auVar194._24_4_ = fVar129 * fVar129;
    auVar194._28_4_ = 0;
    auVar108 = vfmadd231ps_fma(auVar194,auVar16,auVar16);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar15,auVar15);
    auVar114 = vrcpps_avx(ZEXT1632(auVar108));
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar103),ZEXT1632(auVar103));
    auVar116._8_4_ = 0x3f800000;
    auVar116._0_8_ = 0x3f8000003f800000;
    auVar116._12_4_ = 0x3f800000;
    auVar116._16_4_ = 0x3f800000;
    auVar116._20_4_ = 0x3f800000;
    auVar116._24_4_ = 0x3f800000;
    auVar116._28_4_ = 0x3f800000;
    auVar10 = vfnmadd213ps_fma(auVar114,ZEXT1632(auVar108),auVar116);
    auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar114,auVar114);
    local_a00 = vpermps_avx2(_DAT_01fec480,auVar264);
    auVar21 = vpermps_avx2(_DAT_01fec480,auVar281);
    auVar14._4_4_ = fVar219 * local_a00._4_4_;
    auVar14._0_4_ = fVar220 * local_a00._0_4_;
    auVar14._8_4_ = fVar223 * local_a00._8_4_;
    auVar14._12_4_ = fVar98 * local_a00._12_4_;
    auVar14._16_4_ = fVar127 * local_a00._16_4_;
    auVar14._20_4_ = fVar128 * local_a00._20_4_;
    auVar14._24_4_ = fVar129 * local_a00._24_4_;
    auVar14._28_4_ = auVar114._28_4_;
    auVar134 = vfmsub231ps_fma(auVar14,auVar21,auVar15);
    local_a20 = vpermps_avx2(_DAT_01fec480,local_9e0);
    auVar26._4_4_ = fVar271 * local_a20._4_4_;
    auVar26._0_4_ = fVar270 * local_a20._0_4_;
    auVar26._8_4_ = fVar277 * local_a20._8_4_;
    auVar26._12_4_ = fVar294 * local_a20._12_4_;
    auVar26._16_4_ = fVar295 * local_a20._16_4_;
    auVar26._20_4_ = fVar296 * local_a20._20_4_;
    auVar26._24_4_ = fVar297 * local_a20._24_4_;
    auVar26._28_4_ = 0;
    auVar165 = vfmsub231ps_fma(auVar26,local_a00,auVar16);
    auVar134 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar165._12_4_ * auVar165._12_4_,
                                                  CONCAT48(auVar165._8_4_ * auVar165._8_4_,
                                                           CONCAT44(auVar165._4_4_ * auVar165._4_4_,
                                                                    auVar165._0_4_ * auVar165._0_4_)
                                                          ))),ZEXT1632(auVar134),ZEXT1632(auVar134))
    ;
    auVar249._0_4_ = fVar278 * auVar21._0_4_;
    auVar249._4_4_ = fVar222 * auVar21._4_4_;
    auVar249._8_4_ = fVar130 * auVar21._8_4_;
    auVar249._12_4_ = fVar131 * auVar21._12_4_;
    auVar249._16_4_ = fVar267 * auVar21._16_4_;
    auVar249._20_4_ = fVar268 * auVar21._20_4_;
    auVar249._24_4_ = fVar269 * auVar21._24_4_;
    auVar249._28_4_ = 0;
    auVar165 = vfmsub231ps_fma(auVar249,local_a20,auVar119);
    auVar134 = vfmadd231ps_fma(ZEXT1632(auVar134),ZEXT1632(auVar165),ZEXT1632(auVar165));
    auVar114 = vmaxps_avx(ZEXT1632(CONCAT412(auVar103._12_4_ * auVar10._12_4_,
                                             CONCAT48(auVar103._8_4_ * auVar10._8_4_,
                                                      CONCAT44(auVar103._4_4_ * auVar10._4_4_,
                                                               auVar103._0_4_ * auVar10._0_4_)))),
                          ZEXT1632(CONCAT412(auVar134._12_4_ * auVar10._12_4_,
                                             CONCAT48(auVar134._8_4_ * auVar10._8_4_,
                                                      CONCAT44(auVar134._4_4_ * auVar10._4_4_,
                                                               auVar134._0_4_ * auVar10._0_4_)))));
    auVar235._0_4_ = auVar153._0_4_ + auVar211._0_4_;
    auVar235._4_4_ = auVar153._4_4_ + auVar211._4_4_;
    auVar235._8_4_ = auVar153._8_4_ + auVar211._8_4_;
    auVar235._12_4_ = auVar153._12_4_ + auVar211._12_4_;
    auVar235._16_4_ = auVar211._16_4_ + 0.0;
    auVar235._20_4_ = auVar211._20_4_ + 0.0;
    auVar235._24_4_ = auVar211._24_4_ + 0.0;
    local_800._28_4_ = 0;
    local_800._0_28_ = auVar235;
    auVar237._12_4_ = 0;
    auVar237._0_12_ = auVar235._16_12_;
    local_7e0 = ZEXT1632(auVar153);
    auVar147 = vsubps_avx(local_7e0,auVar211);
    auVar22 = vpermps_avx2(_DAT_01fec480,auVar147);
    auVar23 = vpermps_avx2(_DAT_01fec480,local_7e0);
    auVar147 = vmaxps_avx(local_7e0,local_800);
    auVar7 = vmaxps_avx(auVar22,auVar23);
    auVar13 = vrsqrtps_avx(ZEXT1632(auVar108));
    auVar147 = vmaxps_avx(auVar147,auVar7);
    fVar201 = auVar13._0_4_;
    fVar215 = auVar13._4_4_;
    fVar218 = auVar13._8_4_;
    fVar221 = auVar13._12_4_;
    fVar217 = auVar13._16_4_;
    fVar216 = auVar13._20_4_;
    fVar260 = auVar13._24_4_;
    auVar27._4_4_ = fVar215 * fVar215 * fVar215 * auVar108._4_4_ * -0.5;
    auVar27._0_4_ = fVar201 * fVar201 * fVar201 * auVar108._0_4_ * -0.5;
    auVar27._8_4_ = fVar218 * fVar218 * fVar218 * auVar108._8_4_ * -0.5;
    auVar27._12_4_ = fVar221 * fVar221 * fVar221 * auVar108._12_4_ * -0.5;
    auVar27._16_4_ = fVar217 * fVar217 * fVar217 * -0.0;
    auVar27._20_4_ = fVar216 * fVar216 * fVar216 * -0.0;
    auVar27._24_4_ = fVar260 * fVar260 * fVar260 * -0.0;
    auVar27._28_4_ = auVar22._28_4_;
    auVar141._8_4_ = 0x3fc00000;
    auVar141._0_8_ = 0x3fc000003fc00000;
    auVar141._12_4_ = 0x3fc00000;
    auVar141._16_4_ = 0x3fc00000;
    auVar141._20_4_ = 0x3fc00000;
    auVar141._24_4_ = 0x3fc00000;
    auVar141._28_4_ = 0x3fc00000;
    auVar10 = vfmadd231ps_fma(auVar27,auVar141,auVar13);
    auVar245 = ZEXT1664(auVar10);
    fVar215 = auVar10._0_4_;
    fVar221 = auVar10._4_4_;
    auVar28._4_4_ = fVar222 * fVar221;
    auVar28._0_4_ = fVar278 * fVar215;
    fVar260 = auVar10._8_4_;
    auVar28._8_4_ = fVar130 * fVar260;
    fVar278 = auVar10._12_4_;
    auVar28._12_4_ = fVar131 * fVar278;
    auVar28._16_4_ = fVar267 * 0.0;
    auVar28._20_4_ = fVar268 * 0.0;
    auVar28._24_4_ = fVar269 * 0.0;
    auVar28._28_4_ = 0;
    auVar29._4_4_ = (float)local_980._4_4_ * fVar219 * fVar221;
    auVar29._0_4_ = (float)local_980._0_4_ * fVar220 * fVar215;
    auVar29._8_4_ = fStack_978 * fVar223 * fVar260;
    auVar29._12_4_ = fStack_974 * fVar98 * fVar278;
    auVar29._16_4_ = fStack_970 * fVar127 * 0.0;
    auVar29._20_4_ = fStack_96c * fVar128 * 0.0;
    auVar29._24_4_ = fStack_968 * fVar129 * 0.0;
    auVar29._28_4_ = auVar16._28_4_;
    auVar153 = vfmadd231ps_fma(auVar29,auVar28,_local_a60);
    auVar7 = vsubps_avx(ZEXT832(0) << 0x20,auVar170);
    fVar218 = auVar7._0_4_;
    auVar298._0_4_ = fVar220 * fVar215 * fVar218;
    fVar217 = auVar7._4_4_;
    auVar298._4_4_ = fVar219 * fVar221 * fVar217;
    fVar220 = auVar7._8_4_;
    auVar298._8_4_ = fVar223 * fVar260 * fVar220;
    fVar223 = auVar7._12_4_;
    auVar298._12_4_ = fVar98 * fVar278 * fVar223;
    fVar98 = auVar7._16_4_;
    auVar298._16_4_ = fVar127 * 0.0 * fVar98;
    fVar127 = auVar7._20_4_;
    auVar298._20_4_ = fVar128 * 0.0 * fVar127;
    fVar128 = auVar7._24_4_;
    auVar298._24_4_ = fVar129 * 0.0 * fVar128;
    auVar298._28_4_ = 0;
    auVar256 = vsubps_avx(ZEXT832(0) << 0x20,local_960);
    auVar276 = ZEXT3264(auVar256);
    auVar108 = vfmadd231ps_fma(auVar298,auVar256,auVar28);
    auVar30._4_4_ = fVar271 * fVar221;
    auVar30._0_4_ = fVar270 * fVar215;
    auVar30._8_4_ = fVar277 * fVar260;
    auVar30._12_4_ = fVar294 * fVar278;
    auVar30._16_4_ = fVar295 * 0.0;
    auVar30._20_4_ = fVar296 * 0.0;
    auVar30._24_4_ = fVar297 * 0.0;
    auVar30._28_4_ = 0;
    auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar30,_local_820);
    auVar282 = ZEXT1664(auVar153);
    auVar17 = vsubps_avx(ZEXT832(0) << 0x20,auVar115);
    auVar287 = ZEXT3264(auVar17);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar17,auVar30);
    auVar31._4_4_ = (float)local_980._4_4_ * fVar217;
    auVar31._0_4_ = (float)local_980._0_4_ * fVar218;
    auVar31._8_4_ = fStack_978 * fVar220;
    auVar31._12_4_ = fStack_974 * fVar223;
    auVar31._16_4_ = fStack_970 * fVar98;
    auVar31._20_4_ = fStack_96c * fVar127;
    auVar31._24_4_ = fStack_968 * fVar128;
    auVar31._28_4_ = 0;
    auVar103 = vfmadd231ps_fma(auVar31,_local_a60,auVar256);
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),_local_820,auVar17);
    fVar201 = auVar108._0_4_;
    fVar267 = auVar153._0_4_;
    fVar216 = auVar108._4_4_;
    fVar268 = auVar153._4_4_;
    fVar219 = auVar108._8_4_;
    fVar269 = auVar153._8_4_;
    fVar222 = auVar108._12_4_;
    fVar270 = auVar153._12_4_;
    auVar32._28_4_ = auVar13._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(fVar270 * fVar222,
                            CONCAT48(fVar269 * fVar219,CONCAT44(fVar268 * fVar216,fVar267 * fVar201)
                                    )));
    auVar18 = vsubps_avx(ZEXT1632(auVar103),auVar32);
    auVar33._4_4_ = fVar217 * fVar217;
    auVar33._0_4_ = fVar218 * fVar218;
    auVar33._8_4_ = fVar220 * fVar220;
    auVar33._12_4_ = fVar223 * fVar223;
    auVar33._16_4_ = fVar98 * fVar98;
    auVar33._20_4_ = fVar127 * fVar127;
    auVar33._24_4_ = fVar128 * fVar128;
    auVar33._28_4_ = auVar13._28_4_;
    auVar103 = vfmadd231ps_fma(auVar33,auVar256,auVar256);
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar17,auVar17);
    auVar34._28_4_ = auVar15._28_4_;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(fVar222 * fVar222,
                            CONCAT48(fVar219 * fVar219,CONCAT44(fVar216 * fVar216,fVar201 * fVar201)
                                    )));
    auVar13 = vsubps_avx(ZEXT1632(auVar103),auVar34);
    auVar7 = vsqrtps_avx(auVar114);
    fVar201 = (auVar7._0_4_ + auVar147._0_4_) * 1.0000002;
    fVar216 = (auVar7._4_4_ + auVar147._4_4_) * 1.0000002;
    fVar219 = (auVar7._8_4_ + auVar147._8_4_) * 1.0000002;
    fVar222 = (auVar7._12_4_ + auVar147._12_4_) * 1.0000002;
    fVar129 = (auVar7._16_4_ + auVar147._16_4_) * 1.0000002;
    fVar130 = (auVar7._20_4_ + auVar147._20_4_) * 1.0000002;
    fVar131 = (auVar7._24_4_ + auVar147._24_4_) * 1.0000002;
    auVar35._4_4_ = fVar216 * fVar216;
    auVar35._0_4_ = fVar201 * fVar201;
    auVar35._8_4_ = fVar219 * fVar219;
    auVar35._12_4_ = fVar222 * fVar222;
    auVar35._16_4_ = fVar129 * fVar129;
    auVar35._20_4_ = fVar130 * fVar130;
    auVar35._24_4_ = fVar131 * fVar131;
    auVar35._28_4_ = auVar7._28_4_ + auVar147._28_4_;
    local_2c0._0_4_ = auVar18._0_4_ + auVar18._0_4_;
    local_2c0._4_4_ = auVar18._4_4_ + auVar18._4_4_;
    local_2c0._8_4_ = auVar18._8_4_ + auVar18._8_4_;
    local_2c0._12_4_ = auVar18._12_4_ + auVar18._12_4_;
    local_2c0._16_4_ = auVar18._16_4_ + auVar18._16_4_;
    local_2c0._20_4_ = auVar18._20_4_ + auVar18._20_4_;
    local_2c0._24_4_ = auVar18._24_4_ + auVar18._24_4_;
    local_2c0._28_4_ = auVar18._28_4_ + auVar18._28_4_;
    auVar147 = vsubps_avx(auVar13,auVar35);
    auVar281 = ZEXT1632(auVar153);
    local_2a0._28_4_ = 0x3f800002;
    local_2a0._0_28_ =
         ZEXT1628(CONCAT412(fVar270 * fVar270,
                            CONCAT48(fVar269 * fVar269,CONCAT44(fVar268 * fVar268,fVar267 * fVar267)
                                    )));
    auVar18 = vsubps_avx(local_260,local_2a0);
    auVar250._0_4_ = local_2c0._0_4_ * local_2c0._0_4_;
    auVar250._4_4_ = local_2c0._4_4_ * local_2c0._4_4_;
    auVar250._8_4_ = local_2c0._8_4_ * local_2c0._8_4_;
    auVar250._12_4_ = local_2c0._12_4_ * local_2c0._12_4_;
    auVar250._16_4_ = local_2c0._16_4_ * local_2c0._16_4_;
    auVar250._20_4_ = local_2c0._20_4_ * local_2c0._20_4_;
    auVar250._24_4_ = local_2c0._24_4_ * local_2c0._24_4_;
    auVar250._28_4_ = 0;
    fVar216 = auVar18._0_4_;
    fVar219 = auVar18._4_4_;
    fVar222 = auVar18._8_4_;
    fVar129 = auVar18._12_4_;
    fVar130 = auVar18._16_4_;
    fVar131 = auVar18._20_4_;
    fVar267 = auVar18._24_4_;
    auVar36._4_4_ = fVar219 * 4.0 * auVar147._4_4_;
    auVar36._0_4_ = fVar216 * 4.0 * auVar147._0_4_;
    auVar36._8_4_ = fVar222 * 4.0 * auVar147._8_4_;
    auVar36._12_4_ = fVar129 * 4.0 * auVar147._12_4_;
    auVar36._16_4_ = fVar130 * 4.0 * auVar147._16_4_;
    auVar36._20_4_ = fVar131 * 4.0 * auVar147._20_4_;
    auVar36._24_4_ = fVar267 * 4.0 * auVar147._24_4_;
    auVar36._28_4_ = 0x40800000;
    auVar19 = vsubps_avx(auVar250,auVar36);
    auVar114 = vcmpps_avx(auVar19,ZEXT432(0) << 0x20,5);
    auVar299 = ZEXT1632(auVar108);
    fVar201 = auVar18._28_4_;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      auVar251._8_4_ = 0x7f800000;
      auVar251._0_8_ = 0x7f8000007f800000;
      auVar251._12_4_ = 0x7f800000;
      auVar251._16_4_ = 0x7f800000;
      auVar251._20_4_ = 0x7f800000;
      auVar251._24_4_ = 0x7f800000;
      auVar251._28_4_ = 0x7f800000;
      auVar195._8_4_ = 0xff800000;
      auVar195._0_8_ = 0xff800000ff800000;
      auVar195._12_4_ = 0xff800000;
      auVar195._16_4_ = 0xff800000;
      auVar195._20_4_ = 0xff800000;
      auVar195._24_4_ = 0xff800000;
      auVar195._28_4_ = 0xff800000;
    }
    else {
      auVar14 = vsqrtps_avx(auVar19);
      auVar288._0_4_ = fVar216 + fVar216;
      auVar288._4_4_ = fVar219 + fVar219;
      auVar288._8_4_ = fVar222 + fVar222;
      auVar288._12_4_ = fVar129 + fVar129;
      auVar288._16_4_ = fVar130 + fVar130;
      auVar288._20_4_ = fVar131 + fVar131;
      auVar288._24_4_ = fVar267 + fVar267;
      auVar288._28_4_ = fVar201 + fVar201;
      auVar12 = vrcpps_avx(auVar288);
      auVar242 = vcmpps_avx(auVar19,ZEXT432(0) << 0x20,5);
      auVar196._8_4_ = 0x3f800000;
      auVar196._0_8_ = 0x3f8000003f800000;
      auVar196._12_4_ = 0x3f800000;
      auVar196._16_4_ = 0x3f800000;
      auVar196._20_4_ = 0x3f800000;
      auVar196._24_4_ = 0x3f800000;
      auVar196._28_4_ = 0x3f800000;
      auVar153 = vfnmadd213ps_fma(auVar288,auVar12,auVar196);
      auVar153 = vfmadd132ps_fma(ZEXT1632(auVar153),auVar12,auVar12);
      auVar197._0_4_ = (uint)local_2c0._0_4_ ^ local_680;
      auVar197._4_4_ = (uint)local_2c0._4_4_ ^ uStack_67c;
      auVar197._8_4_ = (uint)local_2c0._8_4_ ^ uStack_678;
      auVar197._12_4_ = (uint)local_2c0._12_4_ ^ uStack_674;
      auVar197._16_4_ = (uint)local_2c0._16_4_ ^ (uint)fStack_670;
      auVar197._20_4_ = (uint)local_2c0._20_4_ ^ (uint)fStack_66c;
      auVar197._24_4_ = (uint)local_2c0._24_4_ ^ (uint)fStack_668;
      auVar197._28_4_ = (uint)local_2c0._28_4_ ^ uStack_664;
      auVar19 = vsubps_avx(auVar197,auVar14);
      auVar37._4_4_ = auVar153._4_4_ * auVar19._4_4_;
      auVar37._0_4_ = auVar153._0_4_ * auVar19._0_4_;
      auVar37._8_4_ = auVar153._8_4_ * auVar19._8_4_;
      auVar37._12_4_ = auVar153._12_4_ * auVar19._12_4_;
      auVar37._16_4_ = auVar19._16_4_ * 0.0;
      auVar37._20_4_ = auVar19._20_4_ * 0.0;
      auVar37._24_4_ = auVar19._24_4_ * 0.0;
      auVar37._28_4_ = auVar19._28_4_;
      auVar19 = vsubps_avx(auVar14,local_2c0);
      auVar38._4_4_ = auVar153._4_4_ * auVar19._4_4_;
      auVar38._0_4_ = auVar153._0_4_ * auVar19._0_4_;
      auVar38._8_4_ = auVar153._8_4_ * auVar19._8_4_;
      auVar38._12_4_ = auVar153._12_4_ * auVar19._12_4_;
      auVar38._16_4_ = auVar19._16_4_ * 0.0;
      auVar38._20_4_ = auVar19._20_4_ * 0.0;
      auVar38._24_4_ = auVar19._24_4_ * 0.0;
      auVar38._28_4_ = auVar19._28_4_;
      auVar153 = vfmadd213ps_fma(auVar281,auVar37,auVar299);
      local_340 = auVar153._0_4_ * fVar215;
      fStack_33c = auVar153._4_4_ * fVar221;
      fStack_338 = auVar153._8_4_ * fVar260;
      fStack_334 = auVar153._12_4_ * fVar278;
      uStack_330 = 0;
      uStack_32c = 0;
      uStack_328 = 0;
      fStack_324 = local_2c0._28_4_;
      auVar58._4_4_ = uStack_85c;
      auVar58._0_4_ = local_860;
      auVar58._8_4_ = uStack_858;
      auVar58._12_4_ = uStack_854;
      auVar58._16_4_ = uStack_850;
      auVar58._20_4_ = uStack_84c;
      auVar58._24_4_ = uStack_848;
      auVar58._28_4_ = uStack_844;
      auVar19 = vandps_avx(local_2a0,auVar58);
      auVar19 = vmaxps_avx(local_580,auVar19);
      auVar39._4_4_ = auVar19._4_4_ * 1.9073486e-06;
      auVar39._0_4_ = auVar19._0_4_ * 1.9073486e-06;
      auVar39._8_4_ = auVar19._8_4_ * 1.9073486e-06;
      auVar39._12_4_ = auVar19._12_4_ * 1.9073486e-06;
      auVar39._16_4_ = auVar19._16_4_ * 1.9073486e-06;
      auVar39._20_4_ = auVar19._20_4_ * 1.9073486e-06;
      auVar39._24_4_ = auVar19._24_4_ * 1.9073486e-06;
      auVar39._28_4_ = auVar19._28_4_;
      auVar19 = vandps_avx(auVar18,auVar58);
      auVar19 = vcmpps_avx(auVar19,auVar39,1);
      auVar153 = vfmadd213ps_fma(auVar281,auVar38,auVar299);
      auVar142._8_4_ = 0x7f800000;
      auVar142._0_8_ = 0x7f8000007f800000;
      auVar142._12_4_ = 0x7f800000;
      auVar142._16_4_ = 0x7f800000;
      auVar142._20_4_ = 0x7f800000;
      auVar142._24_4_ = 0x7f800000;
      auVar142._28_4_ = 0x7f800000;
      auVar251 = vblendvps_avx(auVar142,auVar37,auVar242);
      local_360 = auVar153._0_4_ * fVar215;
      fStack_35c = auVar153._4_4_ * fVar221;
      fStack_358 = auVar153._8_4_ * fVar260;
      fStack_354 = auVar153._12_4_ * fVar278;
      uStack_350 = 0;
      uStack_34c = 0;
      uStack_348 = 0;
      uStack_344 = auVar251._28_4_;
      auVar143._8_4_ = 0xff800000;
      auVar143._0_8_ = 0xff800000ff800000;
      auVar143._12_4_ = 0xff800000;
      auVar143._16_4_ = 0xff800000;
      auVar143._20_4_ = 0xff800000;
      auVar143._24_4_ = 0xff800000;
      auVar143._28_4_ = 0xff800000;
      auVar195 = vblendvps_avx(auVar143,auVar38,auVar242);
      auVar12 = auVar242 & auVar19;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar114 = vandps_avx(auVar19,auVar242);
        auVar19 = vcmpps_avx(auVar147,ZEXT832(0) << 0x20,2);
        auVar245 = ZEXT3264(auVar19);
        auVar150._8_4_ = 0xff800000;
        auVar150._0_8_ = 0xff800000ff800000;
        auVar150._12_4_ = 0xff800000;
        auVar150._16_4_ = 0xff800000;
        auVar150._20_4_ = 0xff800000;
        auVar150._24_4_ = 0xff800000;
        auVar150._28_4_ = 0xff800000;
        auVar232._8_4_ = 0x7f800000;
        auVar232._0_8_ = 0x7f8000007f800000;
        auVar232._12_4_ = 0x7f800000;
        auVar232._16_4_ = 0x7f800000;
        auVar232._20_4_ = 0x7f800000;
        auVar232._24_4_ = 0x7f800000;
        auVar232._28_4_ = 0x7f800000;
        auVar147 = vblendvps_avx(auVar232,auVar150,auVar19);
        auVar153 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar12 = vpmovsxwd_avx2(auVar153);
        auVar251 = vblendvps_avx(auVar251,auVar147,auVar12);
        auVar147 = vblendvps_avx(auVar150,auVar232,auVar19);
        auVar195 = vblendvps_avx(auVar195,auVar147,auVar12);
        auVar214._0_8_ = auVar114._0_8_ ^ 0xffffffffffffffff;
        auVar214._8_4_ = auVar114._8_4_ ^ 0xffffffff;
        auVar214._12_4_ = auVar114._12_4_ ^ 0xffffffff;
        auVar214._16_4_ = auVar114._16_4_ ^ 0xffffffff;
        auVar214._20_4_ = auVar114._20_4_ ^ 0xffffffff;
        auVar214._24_4_ = auVar114._24_4_ ^ 0xffffffff;
        auVar214._28_4_ = auVar114._28_4_ ^ 0xffffffff;
        auVar114 = vorps_avx(auVar19,auVar214);
        auVar114 = vandps_avx(auVar242,auVar114);
      }
    }
    auVar265 = ZEXT1664(auVar10);
    auVar147 = local_2e0 & auVar114;
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar147 >> 0x7f,0) != '\0') ||
          (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar147 >> 0xbf,0) != '\0') ||
        (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar147[0x1f] < '\0') {
      local_380 = ZEXT1632(auVar10);
      fVar268 = *(float *)(ray + k * 4 + 0x80);
      local_5b0 = ZEXT416((uint)fVar268);
      fVar269 = fVar268 - (float)local_8e0._0_4_;
      auVar212._4_4_ = fVar269;
      auVar212._0_4_ = fVar269;
      auVar212._8_4_ = fVar269;
      auVar212._12_4_ = fVar269;
      auVar212._16_4_ = fVar269;
      auVar212._20_4_ = fVar269;
      auVar212._24_4_ = fVar269;
      auVar212._28_4_ = fVar269;
      local_320 = vminps_avx(auVar212,auVar195);
      auVar40._4_4_ = fVar152 * fVar217;
      auVar40._0_4_ = fVar132 * fVar218;
      auVar40._8_4_ = fVar180 * fVar220;
      auVar40._12_4_ = fVar181 * fVar223;
      auVar40._16_4_ = fVar182 * fVar98;
      auVar40._20_4_ = fVar261 * fVar127;
      auVar40._24_4_ = fVar266 * fVar128;
      auVar40._28_4_ = fVar269;
      auVar10 = vfmadd213ps_fma(auVar256,local_9e0,auVar40);
      auVar78._4_4_ = fStack_2fc;
      auVar78._0_4_ = local_300;
      auVar78._8_4_ = fStack_2f8;
      auVar78._12_4_ = fStack_2f4;
      auVar78._16_4_ = fStack_2f0;
      auVar78._20_4_ = fStack_2ec;
      auVar78._24_4_ = fStack_2e8;
      auVar78._28_4_ = fStack_2e4;
      auVar19 = vmaxps_avx(auVar78,auVar251);
      auVar153 = vfmadd213ps_fma(auVar17,auVar264,ZEXT1632(auVar10));
      auVar41._4_4_ = (float)local_980._4_4_ * fVar152;
      auVar41._0_4_ = (float)local_980._0_4_ * fVar132;
      auVar41._8_4_ = fStack_978 * fVar180;
      auVar41._12_4_ = fStack_974 * fVar181;
      auVar41._16_4_ = fStack_970 * fVar182;
      auVar41._20_4_ = fStack_96c * fVar261;
      auVar41._24_4_ = fStack_968 * fVar266;
      auVar41._28_4_ = uVar97;
      auVar265 = ZEXT3264(_local_a60);
      auVar10 = vfmadd231ps_fma(auVar41,_local_a60,local_9e0);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar10),_local_820,auVar264);
      auVar59._4_4_ = uStack_85c;
      auVar59._0_4_ = local_860;
      auVar59._8_4_ = uStack_858;
      auVar59._12_4_ = uStack_854;
      auVar59._16_4_ = uStack_850;
      auVar59._20_4_ = uStack_84c;
      auVar59._24_4_ = uStack_848;
      auVar59._28_4_ = uStack_844;
      auVar147 = vandps_avx(auVar59,ZEXT1632(auVar108));
      auVar144._8_4_ = 0x219392ef;
      auVar144._0_8_ = 0x219392ef219392ef;
      auVar144._12_4_ = 0x219392ef;
      auVar144._16_4_ = 0x219392ef;
      auVar144._20_4_ = 0x219392ef;
      auVar144._24_4_ = 0x219392ef;
      auVar144._28_4_ = 0x219392ef;
      auVar256 = vcmpps_avx(auVar147,auVar144,1);
      auVar147 = vrcpps_avx(ZEXT1632(auVar108));
      auVar171._8_4_ = 0x3f800000;
      auVar171._0_8_ = 0x3f8000003f800000;
      auVar171._12_4_ = 0x3f800000;
      auVar171._16_4_ = 0x3f800000;
      auVar171._20_4_ = 0x3f800000;
      auVar171._24_4_ = 0x3f800000;
      auVar171._28_4_ = 0x3f800000;
      auVar242 = ZEXT1632(auVar108);
      auVar10 = vfnmadd213ps_fma(auVar147,auVar242,auVar171);
      auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar147,auVar147);
      auVar289._0_4_ = auVar108._0_4_ ^ local_680;
      auVar289._4_4_ = auVar108._4_4_ ^ uStack_67c;
      auVar289._8_4_ = auVar108._8_4_ ^ uStack_678;
      auVar289._12_4_ = auVar108._12_4_ ^ uStack_674;
      auVar289._16_4_ = fStack_670;
      auVar289._20_4_ = fStack_66c;
      auVar289._24_4_ = fStack_668;
      auVar289._28_4_ = uStack_664;
      auVar42._4_4_ = auVar10._4_4_ * (float)(auVar153._4_4_ ^ uStack_67c);
      auVar42._0_4_ = auVar10._0_4_ * (float)(auVar153._0_4_ ^ local_680);
      auVar42._8_4_ = auVar10._8_4_ * (float)(auVar153._8_4_ ^ uStack_678);
      auVar42._12_4_ = auVar10._12_4_ * (float)(auVar153._12_4_ ^ uStack_674);
      auVar42._16_4_ = fStack_670 * 0.0;
      auVar42._20_4_ = fStack_66c * 0.0;
      auVar42._24_4_ = fStack_668 * 0.0;
      auVar42._28_4_ = uStack_664;
      auVar147 = vcmpps_avx(auVar242,auVar289,1);
      auVar147 = vorps_avx(auVar256,auVar147);
      auVar284._8_4_ = 0xff800000;
      auVar284._0_8_ = 0xff800000ff800000;
      auVar284._12_4_ = 0xff800000;
      auVar284._16_4_ = 0xff800000;
      auVar284._20_4_ = 0xff800000;
      auVar284._24_4_ = 0xff800000;
      auVar284._28_4_ = 0xff800000;
      auVar147 = vblendvps_avx(auVar42,auVar284,auVar147);
      auVar17 = vmaxps_avx(auVar19,auVar147);
      auVar147 = vcmpps_avx(auVar242,auVar289,6);
      auVar147 = vorps_avx(auVar256,auVar147);
      auVar290._8_4_ = 0x7f800000;
      auVar290._0_8_ = 0x7f8000007f800000;
      auVar290._12_4_ = 0x7f800000;
      auVar290._16_4_ = 0x7f800000;
      auVar290._20_4_ = 0x7f800000;
      auVar290._24_4_ = 0x7f800000;
      auVar290._28_4_ = 0x7f800000;
      auVar147 = vblendvps_avx(auVar42,auVar290,auVar147);
      auVar19 = vminps_avx(local_320,auVar147);
      local_a40._28_4_ = auVar21._28_4_;
      fVar218 = (float)(local_680 ^ (uint)auVar21._0_4_);
      fVar217 = (float)(uStack_67c ^ (uint)auVar21._4_4_);
      fVar220 = (float)(uStack_678 ^ (uint)auVar21._8_4_);
      fVar223 = (float)(uStack_674 ^ (uint)auVar21._12_4_);
      fVar98 = (float)((uint)fStack_670 ^ (uint)auVar21._16_4_);
      fVar127 = (float)((uint)fStack_66c ^ (uint)auVar21._20_4_);
      fVar128 = (float)((uint)fStack_668 ^ (uint)auVar21._24_4_);
      auVar243._0_4_ = local_680 ^ (uint)local_a20._0_4_;
      auVar243._4_4_ = uStack_67c ^ (uint)local_a20._4_4_;
      auVar243._8_4_ = uStack_678 ^ (uint)local_a20._8_4_;
      auVar243._12_4_ = uStack_674 ^ (uint)local_a20._12_4_;
      auVar243._16_4_ = (uint)fStack_670 ^ (uint)local_a20._16_4_;
      auVar243._20_4_ = (uint)fStack_66c ^ (uint)local_a20._20_4_;
      auVar243._24_4_ = (uint)fStack_668 ^ (uint)local_a20._24_4_;
      auVar243._28_4_ = uStack_664 ^ local_a20._28_4_;
      auVar256 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar147 = vsubps_avx(auVar256,auVar213);
      auVar256 = vsubps_avx(auVar256,local_7a0);
      auVar43._4_4_ = auVar256._4_4_ * fVar217;
      auVar43._0_4_ = auVar256._0_4_ * fVar218;
      auVar43._8_4_ = auVar256._8_4_ * fVar220;
      auVar43._12_4_ = auVar256._12_4_ * fVar223;
      auVar43._16_4_ = auVar256._16_4_ * fVar98;
      auVar43._20_4_ = auVar256._20_4_ * fVar127;
      auVar43._24_4_ = auVar256._24_4_ * fVar128;
      auVar43._28_4_ = auVar256._28_4_;
      auVar10 = vfmadd231ps_fma(auVar43,auVar243,auVar147);
      auVar252._0_4_ = local_680 ^ (uint)local_a00._0_4_;
      auVar252._4_4_ = uStack_67c ^ (uint)local_a00._4_4_;
      auVar252._8_4_ = uStack_678 ^ (uint)local_a00._8_4_;
      auVar252._12_4_ = uStack_674 ^ (uint)local_a00._12_4_;
      auVar252._16_4_ = (uint)fStack_670 ^ (uint)local_a00._16_4_;
      auVar252._20_4_ = (uint)fStack_66c ^ (uint)local_a00._20_4_;
      auVar252._24_4_ = (uint)fStack_668 ^ (uint)local_a00._24_4_;
      auVar252._28_4_ = uStack_664 ^ local_a00._28_4_;
      auVar147 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar20);
      auVar153 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar252,auVar147);
      auVar44._4_4_ = (float)local_980._4_4_ * fVar217;
      auVar44._0_4_ = (float)local_980._0_4_ * fVar218;
      auVar44._8_4_ = fStack_978 * fVar220;
      auVar44._12_4_ = fStack_974 * fVar223;
      auVar44._16_4_ = fStack_970 * fVar98;
      auVar44._20_4_ = fStack_96c * fVar127;
      auVar44._24_4_ = fStack_968 * fVar128;
      auVar44._28_4_ = uStack_664 ^ local_a40._28_4_;
      auVar10 = vfmadd231ps_fma(auVar44,_local_a60,auVar243);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar10),_local_820,auVar252);
      auVar147 = vandps_avx(auVar59,ZEXT1632(auVar108));
      auVar20 = vrcpps_avx(ZEXT1632(auVar108));
      auVar198._8_4_ = 0x219392ef;
      auVar198._0_8_ = 0x219392ef219392ef;
      auVar198._12_4_ = 0x219392ef;
      auVar198._16_4_ = 0x219392ef;
      auVar198._20_4_ = 0x219392ef;
      auVar198._24_4_ = 0x219392ef;
      auVar198._28_4_ = 0x219392ef;
      auVar256 = vcmpps_avx(auVar147,auVar198,1);
      auVar245 = ZEXT3264(auVar256);
      auVar213 = ZEXT1632(auVar108);
      auVar10 = vfnmadd213ps_fma(auVar20,auVar213,auVar171);
      auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar20,auVar20);
      auVar253._0_4_ = auVar108._0_4_ ^ local_680;
      auVar253._4_4_ = auVar108._4_4_ ^ uStack_67c;
      auVar253._8_4_ = auVar108._8_4_ ^ uStack_678;
      auVar253._12_4_ = auVar108._12_4_ ^ uStack_674;
      auVar253._16_4_ = fStack_670;
      auVar253._20_4_ = fStack_66c;
      auVar253._24_4_ = fStack_668;
      auVar253._28_4_ = uStack_664;
      auVar45._4_4_ = auVar10._4_4_ * (float)(auVar153._4_4_ ^ uStack_67c);
      auVar45._0_4_ = auVar10._0_4_ * (float)(auVar153._0_4_ ^ local_680);
      auVar45._8_4_ = auVar10._8_4_ * (float)(auVar153._8_4_ ^ uStack_678);
      auVar45._12_4_ = auVar10._12_4_ * (float)(auVar153._12_4_ ^ uStack_674);
      auVar45._16_4_ = fStack_670 * 0.0;
      auVar45._20_4_ = fStack_66c * 0.0;
      auVar45._24_4_ = fStack_668 * 0.0;
      auVar45._28_4_ = uStack_664;
      auVar276 = ZEXT3264(auVar45);
      auVar147 = vcmpps_avx(auVar213,auVar253,1);
      auVar147 = vorps_avx(auVar147,auVar256);
      auVar117._8_4_ = 0xff800000;
      auVar117._0_8_ = 0xff800000ff800000;
      auVar117._12_4_ = 0xff800000;
      auVar117._16_4_ = 0xff800000;
      auVar117._20_4_ = 0xff800000;
      auVar117._24_4_ = 0xff800000;
      auVar117._28_4_ = 0xff800000;
      auVar147 = vblendvps_avx(auVar45,auVar117,auVar147);
      auVar287 = ZEXT3264(auVar147);
      _local_9a0 = vmaxps_avx(auVar17,auVar147);
      auVar147 = vcmpps_avx(auVar213,auVar253,6);
      auVar147 = vorps_avx(auVar256,auVar147);
      auVar118._8_4_ = 0x7f800000;
      auVar118._0_8_ = 0x7f8000007f800000;
      auVar118._12_4_ = 0x7f800000;
      auVar118._16_4_ = 0x7f800000;
      auVar118._20_4_ = 0x7f800000;
      auVar118._24_4_ = 0x7f800000;
      auVar118._28_4_ = 0x7f800000;
      auVar147 = vblendvps_avx(auVar45,auVar118,auVar147);
      auVar114 = vandps_avx(local_2e0,auVar114);
      local_3a0 = vminps_avx(auVar19,auVar147);
      auVar147 = vcmpps_avx(_local_9a0,local_3a0,2);
      auVar256 = auVar114 & auVar147;
      if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar256 >> 0x7f,0) != '\0') ||
            (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar256 >> 0xbf,0) != '\0') ||
          (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar256[0x1f] < '\0') {
        auVar77._4_4_ = fStack_33c;
        auVar77._0_4_ = local_340;
        auVar77._8_4_ = fStack_338;
        auVar77._12_4_ = fStack_334;
        auVar77._16_4_ = uStack_330;
        auVar77._20_4_ = uStack_32c;
        auVar77._24_4_ = uStack_328;
        auVar77._28_4_ = fStack_324;
        auVar256 = vminps_avx(auVar77,auVar171);
        auVar287 = ZEXT864(0) << 0x20;
        auVar256 = vmaxps_avx(auVar256,ZEXT832(0) << 0x20);
        auVar76._4_4_ = fStack_35c;
        auVar76._0_4_ = local_360;
        auVar76._8_4_ = fStack_358;
        auVar76._12_4_ = fStack_354;
        auVar76._16_4_ = uStack_350;
        auVar76._20_4_ = uStack_34c;
        auVar76._24_4_ = uStack_348;
        auVar76._28_4_ = uStack_344;
        auVar17 = vminps_avx(auVar76,auVar171);
        auVar17 = vmaxps_avx(auVar17,ZEXT832(0) << 0x20);
        fVar218 = DAT_01faff40._28_4_;
        auVar46._4_4_ = (auVar256._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar46._0_4_ = (auVar256._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar46._8_4_ = (auVar256._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar46._12_4_ = (auVar256._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar46._16_4_ = (auVar256._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar46._20_4_ = (auVar256._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar46._24_4_ = (auVar256._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar46._28_4_ = auVar256._28_4_ + fVar218;
        auVar10 = vfmadd213ps_fma(auVar46,local_7c0,local_940);
        auVar47._4_4_ = (auVar17._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar47._0_4_ = (auVar17._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar47._8_4_ = (auVar17._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar47._12_4_ = (auVar17._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar47._16_4_ = (auVar17._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar47._20_4_ = (auVar17._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar47._24_4_ = (auVar17._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar47._28_4_ = auVar17._28_4_ + fVar218;
        auVar153 = vfmadd213ps_fma(auVar47,local_7c0,local_940);
        auVar256 = vminps_avx(local_7e0,local_800);
        auVar17 = vminps_avx(auVar22,auVar23);
        auVar256 = vminps_avx(auVar256,auVar17);
        auVar7 = vsubps_avx(auVar256,auVar7);
        auVar114 = vandps_avx(auVar147,auVar114);
        local_1a0 = ZEXT1632(auVar10);
        local_1c0 = ZEXT1632(auVar153);
        auVar48._4_4_ = auVar7._4_4_ * 0.99999976;
        auVar48._0_4_ = auVar7._0_4_ * 0.99999976;
        auVar48._8_4_ = auVar7._8_4_ * 0.99999976;
        auVar48._12_4_ = auVar7._12_4_ * 0.99999976;
        auVar48._16_4_ = auVar7._16_4_ * 0.99999976;
        auVar48._20_4_ = auVar7._20_4_ * 0.99999976;
        auVar48._24_4_ = auVar7._24_4_ * 0.99999976;
        auVar48._28_4_ = auVar7._28_4_;
        auVar147 = vmaxps_avx(ZEXT832(0) << 0x20,auVar48);
        auVar49._4_4_ = auVar147._4_4_ * auVar147._4_4_;
        auVar49._0_4_ = auVar147._0_4_ * auVar147._0_4_;
        auVar49._8_4_ = auVar147._8_4_ * auVar147._8_4_;
        auVar49._12_4_ = auVar147._12_4_ * auVar147._12_4_;
        auVar49._16_4_ = auVar147._16_4_ * auVar147._16_4_;
        auVar49._20_4_ = auVar147._20_4_ * auVar147._20_4_;
        auVar49._24_4_ = auVar147._24_4_ * auVar147._24_4_;
        auVar49._28_4_ = auVar147._28_4_;
        auVar7 = vsubps_avx(auVar13,auVar49);
        auVar50._4_4_ = auVar7._4_4_ * fVar219 * 4.0;
        auVar50._0_4_ = auVar7._0_4_ * fVar216 * 4.0;
        auVar50._8_4_ = auVar7._8_4_ * fVar222 * 4.0;
        auVar50._12_4_ = auVar7._12_4_ * fVar129 * 4.0;
        auVar50._16_4_ = auVar7._16_4_ * fVar130 * 4.0;
        auVar50._20_4_ = auVar7._20_4_ * fVar131 * 4.0;
        auVar50._24_4_ = auVar7._24_4_ * fVar267 * 4.0;
        auVar50._28_4_ = auVar147._28_4_;
        auVar13 = vsubps_avx(auVar250,auVar50);
        auVar276 = ZEXT3264(auVar13);
        auVar147 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar147[0x1f]) {
          auVar119 = SUB6432(ZEXT864(0),0) << 0x20;
          local_8a0 = ZEXT832(0) << 0x20;
          _local_6a0 = ZEXT832(0) << 0x20;
          auVar256 = ZEXT832(0) << 0x40;
          auVar178 = ZEXT864(0) << 0x20;
          auVar244._8_4_ = 0x7f800000;
          auVar244._0_8_ = 0x7f8000007f800000;
          auVar244._12_4_ = 0x7f800000;
          auVar244._16_4_ = 0x7f800000;
          auVar244._20_4_ = 0x7f800000;
          auVar244._24_4_ = 0x7f800000;
          auVar244._28_4_ = 0x7f800000;
          auVar254._8_4_ = 0xff800000;
          auVar254._0_8_ = 0xff800000ff800000;
          auVar254._12_4_ = 0xff800000;
          auVar254._16_4_ = 0xff800000;
          auVar254._20_4_ = 0xff800000;
          auVar254._24_4_ = 0xff800000;
          auVar254._28_4_ = 0xff800000;
          local_880 = local_8a0;
        }
        else {
          auVar17 = vsqrtps_avx(auVar13);
          auVar255._0_4_ = fVar216 + fVar216;
          auVar255._4_4_ = fVar219 + fVar219;
          auVar255._8_4_ = fVar222 + fVar222;
          auVar255._12_4_ = fVar129 + fVar129;
          auVar255._16_4_ = fVar130 + fVar130;
          auVar255._20_4_ = fVar131 + fVar131;
          auVar255._24_4_ = fVar267 + fVar267;
          auVar255._28_4_ = fVar201 + fVar201;
          auVar256 = vrcpps_avx(auVar255);
          auVar10 = vfnmadd213ps_fma(auVar255,auVar256,auVar171);
          auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar256,auVar256);
          auVar285._0_4_ = (uint)local_2c0._0_4_ ^ local_680;
          auVar285._4_4_ = (uint)local_2c0._4_4_ ^ uStack_67c;
          auVar285._8_4_ = (uint)local_2c0._8_4_ ^ uStack_678;
          auVar285._12_4_ = (uint)local_2c0._12_4_ ^ uStack_674;
          auVar285._16_4_ = (uint)local_2c0._16_4_ ^ (uint)fStack_670;
          auVar285._20_4_ = (uint)local_2c0._20_4_ ^ (uint)fStack_66c;
          auVar285._24_4_ = (uint)local_2c0._24_4_ ^ (uint)fStack_668;
          auVar285._28_4_ = (uint)local_2c0._28_4_ ^ uStack_664;
          auVar256 = vsubps_avx(auVar285,auVar17);
          auVar19 = vsubps_avx(auVar17,local_2c0);
          fVar201 = auVar256._0_4_ * auVar10._0_4_;
          fVar217 = auVar256._4_4_ * auVar10._4_4_;
          auVar51._4_4_ = fVar217;
          auVar51._0_4_ = fVar201;
          fVar216 = auVar256._8_4_ * auVar10._8_4_;
          auVar51._8_4_ = fVar216;
          fVar220 = auVar256._12_4_ * auVar10._12_4_;
          auVar51._12_4_ = fVar220;
          fVar219 = auVar256._16_4_ * 0.0;
          auVar51._16_4_ = fVar219;
          fVar223 = auVar256._20_4_ * 0.0;
          auVar51._20_4_ = fVar223;
          fVar222 = auVar256._24_4_ * 0.0;
          auVar51._24_4_ = fVar222;
          auVar51._28_4_ = auVar17._28_4_;
          fVar98 = auVar10._0_4_ * auVar19._0_4_;
          fVar127 = auVar10._4_4_ * auVar19._4_4_;
          auVar52._4_4_ = fVar127;
          auVar52._0_4_ = fVar98;
          fVar128 = auVar10._8_4_ * auVar19._8_4_;
          auVar52._8_4_ = fVar128;
          fVar129 = auVar10._12_4_ * auVar19._12_4_;
          auVar52._12_4_ = fVar129;
          fVar130 = auVar19._16_4_ * 0.0;
          auVar52._16_4_ = fVar130;
          fVar131 = auVar19._20_4_ * 0.0;
          auVar52._20_4_ = fVar131;
          fVar132 = auVar19._24_4_ * 0.0;
          auVar52._24_4_ = fVar132;
          auVar52._28_4_ = auVar256._28_4_;
          auVar287 = ZEXT3264(auVar52);
          auVar10 = vfmadd213ps_fma(auVar281,auVar51,auVar299);
          auVar153 = vfmadd213ps_fma(auVar281,auVar52,auVar299);
          auVar256 = ZEXT1632(CONCAT412(auVar10._12_4_ * fVar278,
                                        CONCAT48(auVar10._8_4_ * fVar260,
                                                 CONCAT44(auVar10._4_4_ * fVar221,
                                                          auVar10._0_4_ * fVar215))));
          auVar53._28_4_ = local_a60._28_4_;
          auVar53._0_28_ =
               ZEXT1628(CONCAT412(auVar153._12_4_ * fVar278,
                                  CONCAT48(auVar153._8_4_ * fVar260,
                                           CONCAT44(auVar153._4_4_ * fVar221,
                                                    auVar153._0_4_ * fVar215))));
          auVar10 = vfmadd213ps_fma(auVar15,auVar256,auVar115);
          auVar153 = vfmadd213ps_fma(auVar15,auVar53,auVar115);
          auVar108 = vfmadd213ps_fma(auVar16,auVar256,local_960);
          auVar103 = vfmadd213ps_fma(auVar16,auVar53,local_960);
          auVar134 = vfmadd213ps_fma(auVar256,auVar119,auVar170);
          auVar165 = vfmadd213ps_fma(auVar119,auVar53,auVar170);
          auVar54._4_4_ = (float)local_820._4_4_ * fVar217;
          auVar54._0_4_ = (float)local_820._0_4_ * fVar201;
          auVar54._8_4_ = fStack_818 * fVar216;
          auVar54._12_4_ = fStack_814 * fVar220;
          auVar54._16_4_ = fStack_810 * fVar219;
          auVar54._20_4_ = fStack_80c * fVar223;
          auVar54._24_4_ = fStack_808 * fVar222;
          auVar54._28_4_ = 0;
          auVar119 = vsubps_avx(auVar54,ZEXT1632(auVar10));
          auVar84._4_4_ = (float)local_a60._4_4_ * fVar217;
          auVar84._0_4_ = (float)local_a60._0_4_ * fVar201;
          auVar84._8_4_ = fStack_a58 * fVar216;
          auVar84._12_4_ = fStack_a54 * fVar220;
          auVar84._16_4_ = fStack_a50 * fVar219;
          auVar84._20_4_ = fStack_a4c * fVar223;
          auVar84._24_4_ = fStack_a48 * fVar222;
          auVar84._28_4_ = fVar218;
          auVar256 = vsubps_avx(auVar84,ZEXT1632(auVar108));
          auVar172._0_4_ = (float)local_980._0_4_ * fVar201;
          auVar172._4_4_ = (float)local_980._4_4_ * fVar217;
          auVar172._8_4_ = fStack_978 * fVar216;
          auVar172._12_4_ = fStack_974 * fVar220;
          auVar172._16_4_ = fStack_970 * fVar219;
          auVar172._20_4_ = fStack_96c * fVar223;
          auVar172._24_4_ = fStack_968 * fVar222;
          auVar172._28_4_ = 0;
          auVar15 = vsubps_avx(auVar172,ZEXT1632(auVar134));
          auVar178 = ZEXT3264(auVar15);
          auVar257._0_4_ = (float)local_820._0_4_ * fVar98;
          auVar257._4_4_ = (float)local_820._4_4_ * fVar127;
          auVar257._8_4_ = fStack_818 * fVar128;
          auVar257._12_4_ = fStack_814 * fVar129;
          auVar257._16_4_ = fStack_810 * fVar130;
          auVar257._20_4_ = fStack_80c * fVar131;
          auVar257._24_4_ = fStack_808 * fVar132;
          auVar257._28_4_ = 0;
          local_880 = vsubps_avx(auVar257,ZEXT1632(auVar153));
          auVar55._4_4_ = (float)local_a60._4_4_ * fVar127;
          auVar55._0_4_ = (float)local_a60._0_4_ * fVar98;
          auVar55._8_4_ = fStack_a58 * fVar128;
          auVar55._12_4_ = fStack_a54 * fVar129;
          auVar55._16_4_ = fStack_a50 * fVar130;
          auVar55._20_4_ = fStack_a4c * fVar131;
          auVar55._24_4_ = fStack_a48 * fVar132;
          auVar55._28_4_ = local_880._28_4_;
          local_8a0 = vsubps_avx(auVar55,ZEXT1632(auVar103));
          auVar56._4_4_ = (float)local_980._4_4_ * fVar127;
          auVar56._0_4_ = (float)local_980._0_4_ * fVar98;
          auVar56._8_4_ = fStack_978 * fVar128;
          auVar56._12_4_ = fStack_974 * fVar129;
          auVar56._16_4_ = fStack_970 * fVar130;
          auVar56._20_4_ = fStack_96c * fVar131;
          auVar56._24_4_ = fStack_968 * fVar132;
          auVar56._28_4_ = local_8a0._28_4_;
          _local_6a0 = vsubps_avx(auVar56,ZEXT1632(auVar165));
          auVar282 = ZEXT864(0) << 0x20;
          auVar15 = vcmpps_avx(auVar13,_DAT_01faff00,5);
          auVar258._8_4_ = 0x7f800000;
          auVar258._0_8_ = 0x7f8000007f800000;
          auVar258._12_4_ = 0x7f800000;
          auVar258._16_4_ = 0x7f800000;
          auVar258._20_4_ = 0x7f800000;
          auVar258._24_4_ = 0x7f800000;
          auVar258._28_4_ = 0x7f800000;
          auVar244 = vblendvps_avx(auVar258,auVar51,auVar15);
          auVar60._4_4_ = uStack_85c;
          auVar60._0_4_ = local_860;
          auVar60._8_4_ = uStack_858;
          auVar60._12_4_ = uStack_854;
          auVar60._16_4_ = uStack_850;
          auVar60._20_4_ = uStack_84c;
          auVar60._24_4_ = uStack_848;
          auVar60._28_4_ = uStack_844;
          auVar13 = vandps_avx(auVar60,local_2a0);
          auVar13 = vmaxps_avx(local_580,auVar13);
          auVar57._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar57._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar57._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar57._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar57._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar57._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar57._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar57._28_4_ = auVar13._28_4_;
          auVar13 = vandps_avx(auVar60,auVar18);
          auVar13 = vcmpps_avx(auVar13,auVar57,1);
          auVar276 = ZEXT3264(auVar13);
          auVar259._8_4_ = 0xff800000;
          auVar259._0_8_ = 0xff800000ff800000;
          auVar259._12_4_ = 0xff800000;
          auVar259._16_4_ = 0xff800000;
          auVar259._20_4_ = 0xff800000;
          auVar259._24_4_ = 0xff800000;
          auVar259._28_4_ = 0xff800000;
          auVar254 = vblendvps_avx(auVar259,auVar52,auVar15);
          auVar17 = auVar15 & auVar13;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0x7f,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0x1f] < '\0') {
            auVar147 = vandps_avx(auVar13,auVar15);
            auVar13 = vcmpps_avx(auVar7,ZEXT832(0) << 0x20,2);
            auVar286._8_4_ = 0xff800000;
            auVar286._0_8_ = 0xff800000ff800000;
            auVar286._12_4_ = 0xff800000;
            auVar286._16_4_ = 0xff800000;
            auVar286._20_4_ = 0xff800000;
            auVar286._24_4_ = 0xff800000;
            auVar286._28_4_ = 0xff800000;
            auVar287 = ZEXT3264(auVar286);
            auVar291._8_4_ = 0x7f800000;
            auVar291._0_8_ = 0x7f8000007f800000;
            auVar291._12_4_ = 0x7f800000;
            auVar291._16_4_ = 0x7f800000;
            auVar291._20_4_ = 0x7f800000;
            auVar291._24_4_ = 0x7f800000;
            auVar291._28_4_ = 0x7f800000;
            auVar7 = vblendvps_avx(auVar291,auVar286,auVar13);
            auVar10 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
            auVar17 = vpmovsxwd_avx2(auVar10);
            auVar276 = ZEXT3264(auVar17);
            auVar244 = vblendvps_avx(auVar244,auVar7,auVar17);
            auVar7 = vblendvps_avx(auVar286,auVar291,auVar13);
            auVar282 = ZEXT3264(auVar7);
            auVar254 = vblendvps_avx(auVar254,auVar7,auVar17);
            auVar233._0_8_ = auVar147._0_8_ ^ 0xffffffffffffffff;
            auVar233._8_4_ = auVar147._8_4_ ^ 0xffffffff;
            auVar233._12_4_ = auVar147._12_4_ ^ 0xffffffff;
            auVar233._16_4_ = auVar147._16_4_ ^ 0xffffffff;
            auVar233._20_4_ = auVar147._20_4_ ^ 0xffffffff;
            auVar233._24_4_ = auVar147._24_4_ ^ 0xffffffff;
            auVar233._28_4_ = auVar147._28_4_ ^ 0xffffffff;
            auVar147 = vorps_avx(auVar13,auVar233);
            auVar147 = vandps_avx(auVar15,auVar147);
          }
        }
        auVar265 = ZEXT3264(_local_9a0);
        local_400 = _local_9a0;
        local_3e0 = vminps_avx(local_3a0,auVar244);
        local_a40 = vmaxps_avx(_local_9a0,auVar254);
        auVar245 = ZEXT3264(local_a40);
        local_3c0 = local_a40;
        auVar7 = vcmpps_avx(_local_9a0,local_3e0,2);
        local_600 = vandps_avx(auVar7,auVar114);
        auVar7 = vcmpps_avx(local_a40,local_3a0,2);
        local_660 = vandps_avx(auVar7,auVar114);
        auVar114 = vorps_avx(local_660,local_600);
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          local_620._0_8_ = auVar147._0_8_ ^ 0xffffffffffffffff;
          local_620._8_4_ = auVar147._8_4_ ^ 0xffffffff;
          local_620._12_4_ = auVar147._12_4_ ^ 0xffffffff;
          local_620._16_4_ = auVar147._16_4_ ^ 0xffffffff;
          local_620._20_4_ = auVar147._20_4_ ^ 0xffffffff;
          local_620._24_4_ = auVar147._24_4_ ^ 0xffffffff;
          local_620._28_4_ = auVar147._28_4_ ^ 0xffffffff;
          auVar179._0_4_ = (float)local_980._0_4_ * auVar178._0_4_;
          auVar179._4_4_ = (float)local_980._4_4_ * auVar178._4_4_;
          auVar179._8_4_ = fStack_978 * auVar178._8_4_;
          auVar179._12_4_ = fStack_974 * auVar178._12_4_;
          auVar179._16_4_ = fStack_970 * auVar178._16_4_;
          auVar179._20_4_ = fStack_96c * auVar178._20_4_;
          auVar179._28_36_ = auVar178._28_36_;
          auVar179._24_4_ = fStack_968 * auVar178._24_4_;
          auVar10 = vfmadd213ps_fma(auVar256,_local_a60,auVar179._0_32_);
          auVar10 = vfmadd213ps_fma(auVar119,_local_820,ZEXT1632(auVar10));
          auVar61._4_4_ = uStack_85c;
          auVar61._0_4_ = local_860;
          auVar61._8_4_ = uStack_858;
          auVar61._12_4_ = uStack_854;
          auVar61._16_4_ = uStack_850;
          auVar61._20_4_ = uStack_84c;
          auVar61._24_4_ = uStack_848;
          auVar61._28_4_ = uStack_844;
          auVar114 = vandps_avx(ZEXT1632(auVar10),auVar61);
          auVar145._8_4_ = 0x3e99999a;
          auVar145._0_8_ = 0x3e99999a3e99999a;
          auVar145._12_4_ = 0x3e99999a;
          auVar145._16_4_ = 0x3e99999a;
          auVar145._20_4_ = 0x3e99999a;
          auVar145._24_4_ = 0x3e99999a;
          auVar145._28_4_ = 0x3e99999a;
          auVar114 = vcmpps_avx(auVar114,auVar145,1);
          auVar114 = vorps_avx(auVar114,local_620);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar173,auVar146,auVar114);
          local_640._4_4_ = local_c14;
          local_640._0_4_ = local_c14;
          local_640._8_4_ = local_c14;
          local_640._12_4_ = local_c14;
          local_640._16_4_ = local_c14;
          local_640._20_4_ = local_c14;
          local_640._24_4_ = local_c14;
          local_640._28_4_ = local_c14;
          local_6c0 = vpcmpgtd_avx2(auVar114,local_640);
          local_5e0 = vpandn_avx2(local_6c0,local_600);
          auVar178 = ZEXT3264(local_5e0);
          auVar114 = local_600 & ~local_6c0;
          fStack_b3c = auVar9._4_4_;
          fStack_b38 = auVar9._8_4_;
          fStack_b34 = auVar9._12_4_;
          if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar114 >> 0x7f,0) == '\0') &&
                (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar114 >> 0xbf,0) == '\0') &&
              (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar114[0x1f]) {
            auVar120._4_4_ = fVar268;
            auVar120._0_4_ = fVar268;
            auVar120._8_4_ = fVar268;
            auVar120._12_4_ = fVar268;
            auVar120._16_4_ = fVar268;
            auVar120._20_4_ = fVar268;
            auVar120._24_4_ = fVar268;
            auVar120._28_4_ = fVar268;
            auVar114 = local_660;
            fVar201 = (float)local_980._0_4_;
            fVar218 = (float)local_980._4_4_;
            fVar217 = fStack_978;
            fVar216 = fStack_974;
            fVar260 = fStack_970;
            fVar220 = fStack_96c;
            fVar219 = fStack_968;
            local_a40 = auVar21;
            local_660 = auVar16;
            local_800._16_16_ = auVar237;
          }
          else {
            auVar153 = vminps_avx(auVar11,auVar101);
            auVar10 = vmaxps_avx(auVar11,auVar101);
            auVar108 = vminps_avx(auVar8,auVar9);
            auVar103 = vminps_avx(auVar153,auVar108);
            auVar153 = vmaxps_avx(auVar8,auVar9);
            auVar108 = vmaxps_avx(auVar10,auVar153);
            auVar10 = vandps_avx(auVar103,auVar238);
            auVar153 = vandps_avx(auVar108,auVar238);
            auVar10 = vmaxps_avx(auVar10,auVar153);
            auVar153 = vmovshdup_avx(auVar10);
            auVar153 = vmaxss_avx(auVar153,auVar10);
            auVar10 = vshufpd_avx(auVar10,auVar10,1);
            auVar10 = vmaxss_avx(auVar10,auVar153);
            local_960 = ZEXT1632(CONCAT124(auVar100._4_12_,auVar10._0_4_ * 1.9073486e-06));
            auVar10 = vshufps_avx(auVar108,auVar108,0xff);
            local_840._4_4_ = (float)local_9a0._4_4_ + (float)local_920._4_4_;
            local_840._0_4_ = (float)local_9a0._0_4_ + (float)local_920._0_4_;
            fStack_838 = fStack_998 + fStack_918;
            fStack_834 = fStack_994 + fStack_914;
            fStack_830 = fStack_990 + fStack_910;
            fStack_82c = fStack_98c + fStack_90c;
            fStack_828 = fStack_988 + fStack_908;
            fStack_824 = fStack_984 + fStack_904;
            do {
              auVar121._8_4_ = 0x7f800000;
              auVar121._0_8_ = 0x7f8000007f800000;
              auVar121._12_4_ = 0x7f800000;
              auVar121._16_4_ = 0x7f800000;
              auVar121._20_4_ = 0x7f800000;
              auVar121._24_4_ = 0x7f800000;
              auVar121._28_4_ = 0x7f800000;
              auVar114 = auVar178._0_32_;
              auVar147 = vblendvps_avx(auVar121,_local_9a0,auVar114);
              auVar7 = vshufps_avx(auVar147,auVar147,0xb1);
              auVar7 = vminps_avx(auVar147,auVar7);
              auVar13 = vshufpd_avx(auVar7,auVar7,5);
              auVar7 = vminps_avx(auVar7,auVar13);
              auVar13 = vpermpd_avx2(auVar7,0x4e);
              auVar7 = vminps_avx(auVar7,auVar13);
              auVar147 = vcmpps_avx(auVar147,auVar7,0);
              auVar7 = auVar114 & auVar147;
              if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar7 >> 0x7f,0) != '\0') ||
                    (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar7 >> 0xbf,0) != '\0') ||
                  (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar7[0x1f] < '\0') {
                auVar114 = vandps_avx(auVar147,auVar114);
              }
              uVar86 = vmovmskps_avx(auVar114);
              iVar24 = 0;
              for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar87 = iVar24 << 2;
              *(undefined4 *)(local_5e0 + uVar87) = 0;
              uVar86 = *(uint *)(local_1a0 + uVar87);
              uVar87 = *(uint *)(local_400 + uVar87);
              fVar201 = auVar5._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar201 = sqrtf((float)local_9c0._0_4_);
              }
              local_a00._0_4_ = fVar201 * 1.9073486e-06;
              auVar100 = vinsertps_avx(ZEXT416(uVar87),ZEXT416(uVar86),0x10);
              auVar265 = ZEXT1664(auVar100);
              bVar94 = true;
              uVar90 = 0;
              do {
                auVar165 = auVar265._0_16_;
                auVar153 = vmovshdup_avx(auVar165);
                fVar215 = auVar153._0_4_;
                fVar216 = 1.0 - fVar215;
                fVar221 = fVar216 * fVar216 * fVar216;
                fVar217 = fVar215 * fVar215;
                fVar218 = fVar215 * fVar217;
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar221),
                                           ZEXT416((uint)fVar218));
                fVar201 = fVar215 * fVar216;
                auVar103 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar216 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar134 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar215 * fVar201)));
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                           ZEXT416((uint)fVar221));
                fVar215 = (auVar100._0_4_ + auVar134._0_4_) * 0.16666667;
                fVar218 = fVar218 * 0.16666667;
                auVar135._0_4_ = fVar218 * fVar126;
                auVar135._4_4_ = fVar218 * fStack_b3c;
                auVar135._8_4_ = fVar218 * fStack_b38;
                auVar135._12_4_ = fVar218 * fStack_b34;
                auVar183._4_4_ = fVar215;
                auVar183._0_4_ = fVar215;
                auVar183._8_4_ = fVar215;
                auVar183._12_4_ = fVar215;
                auVar100 = vfmadd132ps_fma(auVar183,auVar135,auVar8);
                fVar215 = (auVar108._0_4_ + auVar103._0_4_) * 0.16666667;
                auVar136._4_4_ = fVar215;
                auVar136._0_4_ = fVar215;
                auVar136._8_4_ = fVar215;
                auVar136._12_4_ = fVar215;
                auVar100 = vfmadd132ps_fma(auVar136,auVar100,auVar101);
                fVar218 = auVar265._0_4_;
                auVar154._4_4_ = fVar218;
                auVar154._0_4_ = fVar218;
                auVar154._8_4_ = fVar218;
                auVar154._12_4_ = fVar218;
                auVar108 = vfmadd213ps_fma(auVar154,local_9b0,_DAT_01f7aa10);
                fVar221 = fVar221 * 0.16666667;
                auVar102._4_4_ = fVar221;
                auVar102._0_4_ = fVar221;
                auVar102._8_4_ = fVar221;
                auVar102._12_4_ = fVar221;
                auVar100 = vfmadd132ps_fma(auVar102,auVar100,auVar11);
                local_7a0._0_16_ = auVar100;
                auVar108 = vsubps_avx(auVar108,auVar100);
                auVar100 = vdpps_avx(auVar108,auVar108,0x7f);
                fVar215 = auVar100._0_4_;
                if (fVar215 < 0.0) {
                  local_9e0._0_4_ = fVar217;
                  auVar245._0_4_ = sqrtf(fVar215);
                  auVar245._4_60_ = extraout_var;
                  auVar103 = auVar245._0_16_;
                  fVar217 = (float)local_9e0._0_4_;
                }
                else {
                  auVar103 = vsqrtss_avx(auVar100,auVar100);
                }
                auVar133 = ZEXT416((uint)fVar216);
                auVar104._4_4_ = fVar216;
                auVar104._0_4_ = fVar216;
                auVar104._8_4_ = fVar216;
                auVar104._12_4_ = fVar216;
                auVar202 = vfnmsub213ss_fma(auVar153,auVar153,ZEXT416((uint)(fVar201 * 4.0)));
                auVar134 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),auVar133,auVar133);
                fVar201 = fVar216 * -fVar216 * 0.5;
                fVar221 = auVar202._0_4_ * 0.5;
                fVar216 = auVar134._0_4_ * 0.5;
                fVar217 = fVar217 * 0.5;
                auVar228._0_4_ = fVar126 * fVar217;
                auVar228._4_4_ = fStack_b3c * fVar217;
                auVar228._8_4_ = fStack_b38 * fVar217;
                auVar228._12_4_ = fStack_b34 * fVar217;
                auVar184._4_4_ = fVar216;
                auVar184._0_4_ = fVar216;
                auVar184._8_4_ = fVar216;
                auVar184._12_4_ = fVar216;
                auVar134 = vfmadd213ps_fma(auVar184,auVar8,auVar228);
                auVar203._4_4_ = fVar221;
                auVar203._0_4_ = fVar221;
                auVar203._8_4_ = fVar221;
                auVar203._12_4_ = fVar221;
                auVar134 = vfmadd213ps_fma(auVar203,auVar101,auVar134);
                auVar274._4_4_ = fVar201;
                auVar274._0_4_ = fVar201;
                auVar274._8_4_ = fVar201;
                auVar274._12_4_ = fVar201;
                auVar99 = vfmadd213ps_fma(auVar274,auVar11,auVar134);
                auVar134 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar133,auVar153);
                auVar202 = vfmadd213ss_fma(auVar153,SUB6416(ZEXT464(0xc0000000),0),auVar133);
                auVar153 = vshufps_avx(auVar165,auVar165,0x55);
                auVar185._0_4_ = fVar126 * auVar153._0_4_;
                auVar185._4_4_ = fStack_b3c * auVar153._4_4_;
                auVar185._8_4_ = fStack_b38 * auVar153._8_4_;
                auVar185._12_4_ = fStack_b34 * auVar153._12_4_;
                uVar97 = auVar202._0_4_;
                auVar204._4_4_ = uVar97;
                auVar204._0_4_ = uVar97;
                auVar204._8_4_ = uVar97;
                auVar204._12_4_ = uVar97;
                auVar153 = vfmadd213ps_fma(auVar204,auVar8,auVar185);
                auVar155._0_4_ = auVar134._0_4_;
                auVar155._4_4_ = auVar155._0_4_;
                auVar155._8_4_ = auVar155._0_4_;
                auVar155._12_4_ = auVar155._0_4_;
                auVar153 = vfmadd213ps_fma(auVar155,auVar101,auVar153);
                auVar133 = vfmadd231ps_fma(auVar153,auVar11,auVar104);
                auVar134 = vdpps_avx(auVar99,auVar99,0x7f);
                auVar153 = vblendps_avx(auVar134,_DAT_01f7aa10,0xe);
                auVar202 = vrsqrtss_avx(auVar153,auVar153);
                fVar201 = auVar202._0_4_;
                fVar217 = auVar134._0_4_;
                fVar201 = fVar201 * 1.5 + fVar217 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar202 = vdpps_avx(auVar99,auVar133,0x7f);
                auVar156._0_4_ = auVar133._0_4_ * fVar217;
                auVar156._4_4_ = auVar133._4_4_ * fVar217;
                auVar156._8_4_ = auVar133._8_4_ * fVar217;
                auVar156._12_4_ = auVar133._12_4_ * fVar217;
                fVar221 = auVar202._0_4_;
                auVar229._0_4_ = auVar99._0_4_ * fVar221;
                auVar229._4_4_ = auVar99._4_4_ * fVar221;
                fVar216 = auVar99._8_4_;
                auVar229._8_4_ = fVar216 * fVar221;
                fVar260 = auVar99._12_4_;
                auVar229._12_4_ = fVar260 * fVar221;
                auVar202 = vsubps_avx(auVar156,auVar229);
                auVar153 = vrcpss_avx(auVar153,auVar153);
                auVar133 = vfnmadd213ss_fma(auVar153,auVar134,ZEXT416(0x40000000));
                fVar221 = auVar153._0_4_ * auVar133._0_4_;
                auVar153 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar218 * (float)local_a00._0_4_)));
                auVar287 = ZEXT1664(auVar153);
                auVar248._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
                auVar248._8_4_ = -fVar216;
                auVar248._12_4_ = -fVar260;
                auVar186._0_4_ = fVar201 * auVar202._0_4_ * fVar221;
                auVar186._4_4_ = fVar201 * auVar202._4_4_ * fVar221;
                auVar186._8_4_ = fVar201 * auVar202._8_4_ * fVar221;
                auVar186._12_4_ = fVar201 * auVar202._12_4_ * fVar221;
                auVar240._0_4_ = auVar99._0_4_ * fVar201;
                auVar240._4_4_ = auVar99._4_4_ * fVar201;
                auVar240._8_4_ = fVar216 * fVar201;
                auVar240._12_4_ = fVar260 * fVar201;
                if (fVar217 < -fVar217) {
                  local_9e0._0_4_ = auVar103._0_4_;
                  local_a20._0_16_ = auVar240;
                  local_940._0_16_ = auVar186;
                  fVar201 = sqrtf(fVar217);
                  auVar287 = ZEXT464(auVar153._0_4_);
                  auVar103 = ZEXT416((uint)local_9e0._0_4_);
                  auVar186 = local_940._0_16_;
                  auVar240 = local_a20._0_16_;
                }
                else {
                  auVar134 = vsqrtss_avx(auVar134,auVar134);
                  fVar201 = auVar134._0_4_;
                }
                auVar134 = vdpps_avx(auVar108,auVar240,0x7f);
                auVar157 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar103,auVar287._0_16_);
                auVar202 = vdpps_avx(auVar248,auVar240,0x7f);
                auVar133 = vdpps_avx(auVar108,auVar186,0x7f);
                local_9e0._0_16_ = vdpps_avx(local_9b0,auVar240,0x7f);
                auVar157 = vfmadd213ss_fma(ZEXT416((uint)(auVar103._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_960._0_4_ / fVar201)),
                                           auVar157);
                auVar282 = ZEXT1664(auVar157);
                fVar201 = auVar202._0_4_ + auVar133._0_4_;
                auVar105._0_4_ = auVar134._0_4_ * auVar134._0_4_;
                auVar105._4_4_ = auVar134._4_4_ * auVar134._4_4_;
                auVar105._8_4_ = auVar134._8_4_ * auVar134._8_4_;
                auVar105._12_4_ = auVar134._12_4_ * auVar134._12_4_;
                auVar103 = vdpps_avx(auVar108,auVar248,0x7f);
                auVar133 = vsubps_avx(auVar100,auVar105);
                auVar202 = vrsqrtss_avx(auVar133,auVar133);
                fVar221 = auVar133._0_4_;
                fVar218 = auVar202._0_4_;
                fVar218 = fVar218 * 1.5 + fVar221 * -0.5 * fVar218 * fVar218 * fVar218;
                auVar202 = vdpps_avx(auVar108,local_9b0,0x7f);
                auVar103 = vfnmadd231ss_fma(auVar103,auVar134,ZEXT416((uint)fVar201));
                auVar202 = vfnmadd231ss_fma(auVar202,auVar134,local_9e0._0_16_);
                if (fVar221 < 0.0) {
                  local_a20._0_16_ = auVar134;
                  local_940._0_4_ = auVar157._0_4_;
                  local_7c0._0_16_ = ZEXT416((uint)fVar201);
                  local_7e0._0_4_ = fVar218;
                  local_800._0_16_ = auVar202;
                  fVar221 = sqrtf(fVar221);
                  auVar282 = ZEXT464((uint)local_940._0_4_);
                  auVar287 = ZEXT464(auVar153._0_4_);
                  fVar218 = (float)local_7e0._0_4_;
                  auVar202 = local_800._0_16_;
                  auVar134 = local_a20._0_16_;
                  auVar153 = local_7c0._0_16_;
                }
                else {
                  auVar153 = vsqrtss_avx(auVar133,auVar133);
                  fVar221 = auVar153._0_4_;
                  auVar153 = ZEXT416((uint)fVar201);
                }
                auVar276 = ZEXT1664(auVar99);
                auVar133 = vpermilps_avx(local_7a0._0_16_,0xff);
                fVar221 = fVar221 - auVar133._0_4_;
                auVar133 = vshufps_avx(auVar99,auVar99,0xff);
                auVar103 = vfmsub213ss_fma(auVar103,ZEXT416((uint)fVar218),auVar133);
                auVar187._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
                auVar187._8_4_ = local_9e0._8_4_ ^ 0x80000000;
                auVar187._12_4_ = local_9e0._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar103._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar103._12_4_ ^ 0x80000000;
                auVar157 = ZEXT416((uint)(auVar202._0_4_ * fVar218));
                auVar202 = vfmsub231ss_fma(ZEXT416((uint)(auVar103._0_4_ * local_9e0._0_4_)),
                                           auVar153,auVar157);
                auVar103 = vinsertps_avx(auVar205,auVar157,0x1c);
                uVar97 = auVar202._0_4_;
                auVar206._4_4_ = uVar97;
                auVar206._0_4_ = uVar97;
                auVar206._8_4_ = uVar97;
                auVar206._12_4_ = uVar97;
                auVar103 = vdivps_avx(auVar103,auVar206);
                auVar153 = vinsertps_avx(auVar153,auVar187,0x10);
                auVar153 = vdivps_avx(auVar153,auVar206);
                fVar201 = auVar134._0_4_;
                auVar158._0_4_ = fVar201 * auVar103._0_4_ + fVar221 * auVar153._0_4_;
                auVar158._4_4_ = fVar201 * auVar103._4_4_ + fVar221 * auVar153._4_4_;
                auVar158._8_4_ = fVar201 * auVar103._8_4_ + fVar221 * auVar153._8_4_;
                auVar158._12_4_ = fVar201 * auVar103._12_4_ + fVar221 * auVar153._12_4_;
                auVar103 = vsubps_avx(auVar165,auVar158);
                auVar265 = ZEXT1664(auVar103);
                auVar153 = vandps_avx(auVar134,auVar238);
                fVar201 = (float)local_980._0_4_;
                fVar218 = (float)local_980._4_4_;
                fVar217 = fStack_978;
                fVar216 = fStack_974;
                fVar260 = fStack_970;
                fVar220 = fStack_96c;
                fVar219 = fStack_968;
                if (auVar153._0_4_ < auVar282._0_4_) {
                  auVar134 = vfmadd231ss_fma(ZEXT416((uint)(auVar287._0_4_ + auVar282._0_4_)),
                                             auVar10,ZEXT416(0x36000000));
                  auVar153 = vandps_avx(ZEXT416((uint)fVar221),auVar238);
                  if (auVar153._0_4_ < auVar134._0_4_) {
                    fVar221 = auVar103._0_4_ + (float)local_8e0._0_4_;
                    if (fVar221 < fVar96) {
                      bVar95 = 0;
                    }
                    else {
                      fVar278 = *(float *)(ray + k * 4 + 0x80);
                      auVar282 = ZEXT464((uint)fVar278);
                      if (fVar278 < fVar221) {
                        bVar95 = 0;
                      }
                      else {
                        auVar153 = vmovshdup_avx(auVar103);
                        bVar95 = 0;
                        if ((0.0 <= auVar153._0_4_) && (auVar153._0_4_ <= 1.0)) {
                          auVar100 = vrsqrtss_avx(auVar100,auVar100);
                          fVar223 = auVar100._0_4_;
                          pGVar3 = (context->scene->geometries).items[uVar88].ptr;
                          if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar95 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar95 = 1, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar215 = fVar223 * 1.5 + fVar215 * -0.5 * fVar223 * fVar223 * fVar223;
                            local_ac0 = auVar108._0_4_;
                            fStack_abc = auVar108._4_4_;
                            fStack_ab8 = auVar108._8_4_;
                            fStack_ab4 = auVar108._12_4_;
                            auVar159._0_4_ = fVar215 * local_ac0;
                            auVar159._4_4_ = fVar215 * fStack_abc;
                            auVar159._8_4_ = fVar215 * fStack_ab8;
                            auVar159._12_4_ = fVar215 * fStack_ab4;
                            auVar134 = vfmadd213ps_fma(auVar133,auVar159,auVar99);
                            auVar100 = vshufps_avx(auVar159,auVar159,0xc9);
                            auVar153 = vshufps_avx(auVar99,auVar99,0xc9);
                            auVar160._0_4_ = auVar159._0_4_ * auVar153._0_4_;
                            auVar160._4_4_ = auVar159._4_4_ * auVar153._4_4_;
                            auVar160._8_4_ = auVar159._8_4_ * auVar153._8_4_;
                            auVar160._12_4_ = auVar159._12_4_ * auVar153._12_4_;
                            auVar108 = vfmsub231ps_fma(auVar160,auVar99,auVar100);
                            auVar100 = vshufps_avx(auVar108,auVar108,0xc9);
                            auVar153 = vshufps_avx(auVar134,auVar134,0xc9);
                            auVar108 = vshufps_avx(auVar108,auVar108,0xd2);
                            auVar106._0_4_ = auVar134._0_4_ * auVar108._0_4_;
                            auVar106._4_4_ = auVar134._4_4_ * auVar108._4_4_;
                            auVar106._8_4_ = auVar134._8_4_ * auVar108._8_4_;
                            auVar106._12_4_ = auVar134._12_4_ * auVar108._12_4_;
                            auVar100 = vfmsub231ps_fma(auVar106,auVar100,auVar153);
                            local_730 = vshufps_avx(auVar103,auVar103,0x55);
                            local_760 = (RTCHitN  [16])vshufps_avx(auVar100,auVar100,0x55);
                            auStack_750 = vshufps_avx(auVar100,auVar100,0xaa);
                            local_740 = auVar100._0_4_;
                            local_720 = ZEXT416(0) << 0x20;
                            local_710 = CONCAT44(uStack_77c,local_780);
                            uStack_708 = CONCAT44(uStack_774,uStack_778);
                            local_700._4_4_ = uStack_76c;
                            local_700._0_4_ = local_770;
                            local_700._8_4_ = uStack_768;
                            local_700._12_4_ = uStack_764;
                            vpcmpeqd_avx2(ZEXT1632(local_700),ZEXT1632(local_700));
                            uStack_6ec = context->user->instID[0];
                            local_6f0 = uStack_6ec;
                            uStack_6e8 = uStack_6ec;
                            uStack_6e4 = uStack_6ec;
                            uStack_6e0 = context->user->instPrimID[0];
                            uStack_6dc = uStack_6e0;
                            uStack_6d8 = uStack_6e0;
                            uStack_6d4 = uStack_6e0;
                            *(float *)(ray + k * 4 + 0x80) = fVar221;
                            auVar100 = *(undefined1 (*) [16])
                                        (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_900._0_16_ = auVar100;
                            local_a90.valid = (int *)local_900;
                            local_a90.geometryUserPtr = pGVar3->userPtr;
                            local_a90.context = context->user;
                            local_a90.hit = local_760;
                            local_a90.N = 4;
                            local_a90.ray = (RTCRayN *)ray;
                            uStack_73c = local_740;
                            uStack_738 = local_740;
                            uStack_734 = local_740;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar265 = ZEXT1664(auVar103);
                              auVar276 = ZEXT1664(auVar99);
                              auVar287 = ZEXT1664(auVar287._0_16_);
                              (*pGVar3->occlusionFilterN)(&local_a90);
                              auVar100 = local_900._0_16_;
                              fVar201 = (float)local_980._0_4_;
                              fVar218 = (float)local_980._4_4_;
                              fVar217 = fStack_978;
                              fVar216 = fStack_974;
                              fVar260 = fStack_970;
                              fVar220 = fStack_96c;
                              fVar219 = fStack_968;
                            }
                            if (auVar100 == (undefined1  [16])0x0) {
                              auVar100 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar100 = auVar100 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar265 = ZEXT1664(auVar265._0_16_);
                                auVar276 = ZEXT1664(auVar276._0_16_);
                                auVar287 = ZEXT1664(auVar287._0_16_);
                                (*p_Var4)(&local_a90);
                                auVar100 = local_900._0_16_;
                                fVar201 = (float)local_980._0_4_;
                                fVar218 = (float)local_980._4_4_;
                                fVar217 = fStack_978;
                                fVar216 = fStack_974;
                                fVar260 = fStack_970;
                                fVar220 = fStack_96c;
                                fVar219 = fStack_968;
                              }
                              auVar153 = vpcmpeqd_avx(auVar100,_DAT_01f7aa10);
                              auVar100 = auVar153 ^ _DAT_01f7ae20;
                              auVar161._8_4_ = 0xff800000;
                              auVar161._0_8_ = 0xff800000ff800000;
                              auVar161._12_4_ = 0xff800000;
                              auVar153 = vblendvps_avx(auVar161,*(undefined1 (*) [16])
                                                                 (local_a90.ray + 0x80),auVar153);
                              *(undefined1 (*) [16])(local_a90.ray + 0x80) = auVar153;
                            }
                            auVar282 = ZEXT464((uint)fVar278);
                            auVar137._8_8_ = 0x100000001;
                            auVar137._0_8_ = 0x100000001;
                            bVar95 = (auVar137 & auVar100) != (undefined1  [16])0x0;
                            if (!(bool)bVar95) {
                              *(float *)(ray + k * 4 + 0x80) = fVar278;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_015b8a0a;
                  }
                }
                bVar94 = uVar90 < 4;
                uVar90 = uVar90 + 1;
              } while (uVar90 != 5);
              bVar94 = false;
              bVar95 = 5;
LAB_015b8a0a:
              bVar91 = (bool)(bVar91 | bVar94 & bVar95);
              uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar120._4_4_ = uVar97;
              auVar120._0_4_ = uVar97;
              auVar120._8_4_ = uVar97;
              auVar120._12_4_ = uVar97;
              auVar120._16_4_ = uVar97;
              auVar120._20_4_ = uVar97;
              auVar120._24_4_ = uVar97;
              auVar120._28_4_ = uVar97;
              auVar147 = vcmpps_avx(_local_840,auVar120,2);
              auVar114 = vandps_avx(auVar147,local_5e0);
              auVar178 = ZEXT3264(auVar114);
              auVar147 = local_5e0 & auVar147;
              local_5e0 = auVar114;
            } while ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar147 >> 0x7f,0) != '\0') ||
                       (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar147 >> 0xbf,0) != '\0') ||
                     (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar147[0x1f] < '\0');
            auVar178 = ZEXT3264(local_3c0);
            auVar245 = ZEXT3264(local_a40);
            auVar114 = local_660;
          }
          auVar13 = local_3c0;
          auVar151._0_4_ = fVar201 * (float)local_6a0._0_4_;
          auVar151._4_4_ = fVar218 * (float)local_6a0._4_4_;
          auVar151._8_4_ = fVar217 * fStack_698;
          auVar151._12_4_ = fVar216 * fStack_694;
          auVar151._16_4_ = fVar260 * fStack_690;
          auVar151._20_4_ = fVar220 * fStack_68c;
          auVar151._28_36_ = auVar178._28_36_;
          auVar151._24_4_ = fVar219 * fStack_688;
          auVar10 = vfmadd213ps_fma(local_8a0,_local_a60,auVar151._0_32_);
          auVar10 = vfmadd213ps_fma(local_880,_local_820,ZEXT1632(auVar10));
          auVar62._4_4_ = uStack_85c;
          auVar62._0_4_ = local_860;
          auVar62._8_4_ = uStack_858;
          auVar62._12_4_ = uStack_854;
          auVar62._16_4_ = uStack_850;
          auVar62._20_4_ = uStack_84c;
          auVar62._24_4_ = uStack_848;
          auVar62._28_4_ = uStack_844;
          auVar147 = vandps_avx(ZEXT1632(auVar10),auVar62);
          auVar174._8_4_ = 0x3e99999a;
          auVar174._0_8_ = 0x3e99999a3e99999a;
          auVar174._12_4_ = 0x3e99999a;
          auVar174._16_4_ = 0x3e99999a;
          auVar174._20_4_ = 0x3e99999a;
          auVar174._24_4_ = 0x3e99999a;
          auVar174._28_4_ = 0x3e99999a;
          auVar147 = vcmpps_avx(auVar147,auVar174,1);
          auVar7 = vorps_avx(auVar147,local_620);
          auVar175._0_4_ = (float)local_920._0_4_ + auVar245._0_4_;
          auVar175._4_4_ = (float)local_920._4_4_ + auVar245._4_4_;
          auVar175._8_4_ = fStack_918 + auVar245._8_4_;
          auVar175._12_4_ = fStack_914 + auVar245._12_4_;
          auVar175._16_4_ = fStack_910 + auVar245._16_4_;
          auVar175._20_4_ = fStack_90c + auVar245._20_4_;
          auVar175._24_4_ = fStack_908 + auVar245._24_4_;
          auVar175._28_4_ = fStack_904 + auVar245._28_4_;
          auVar147 = vcmpps_avx(auVar175,auVar120,2);
          local_880 = vandps_avx(auVar114,auVar147);
          auVar176._8_4_ = 3;
          auVar176._0_8_ = 0x300000003;
          auVar176._12_4_ = 3;
          auVar176._16_4_ = 3;
          auVar176._20_4_ = 3;
          auVar176._24_4_ = 3;
          auVar176._28_4_ = 3;
          auVar199._8_4_ = 2;
          auVar199._0_8_ = 0x200000002;
          auVar199._12_4_ = 2;
          auVar199._16_4_ = 2;
          auVar199._20_4_ = 2;
          auVar199._24_4_ = 2;
          auVar199._28_4_ = 2;
          auVar114 = vblendvps_avx(auVar199,auVar176,auVar7);
          local_8a0 = vpcmpgtd_avx2(auVar114,local_640);
          auVar114 = vpandn_avx2(local_8a0,local_880);
          auVar147 = local_880 & ~local_8a0;
          local_900 = auVar114;
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            auVar100 = vminps_avx(auVar11,auVar101);
            auVar10 = vmaxps_avx(auVar11,auVar101);
            auVar153 = vminps_avx(auVar8,auVar9);
            auVar108 = vminps_avx(auVar100,auVar153);
            auVar100 = vmaxps_avx(auVar8,auVar9);
            auVar153 = vmaxps_avx(auVar10,auVar100);
            auVar10 = vandps_avx(auVar108,auVar238);
            auVar100 = vandps_avx(auVar153,auVar238);
            auVar10 = vmaxps_avx(auVar10,auVar100);
            auVar100 = vmovshdup_avx(auVar10);
            auVar100 = vmaxss_avx(auVar100,auVar10);
            auVar10 = vshufpd_avx(auVar10,auVar10,1);
            auVar10 = vmaxss_avx(auVar10,auVar100);
            local_960._0_4_ = auVar10._0_4_ * 1.9073486e-06;
            local_800._0_16_ = vshufps_avx(auVar153,auVar153,0xff);
            local_840._4_4_ = (float)local_920._4_4_ + local_3c0._4_4_;
            local_840._0_4_ = (float)local_920._0_4_ + local_3c0._0_4_;
            fStack_838 = fStack_918 + local_3c0._8_4_;
            fStack_834 = fStack_914 + local_3c0._12_4_;
            fStack_830 = fStack_910 + local_3c0._16_4_;
            fStack_82c = fStack_90c + local_3c0._20_4_;
            fStack_828 = fStack_908 + local_3c0._24_4_;
            fStack_824 = fStack_904 + local_3c0._28_4_;
            do {
              auVar122._8_4_ = 0x7f800000;
              auVar122._0_8_ = 0x7f8000007f800000;
              auVar122._12_4_ = 0x7f800000;
              auVar122._16_4_ = 0x7f800000;
              auVar122._20_4_ = 0x7f800000;
              auVar122._24_4_ = 0x7f800000;
              auVar122._28_4_ = 0x7f800000;
              auVar147 = vblendvps_avx(auVar122,auVar13,auVar114);
              auVar7 = vshufps_avx(auVar147,auVar147,0xb1);
              auVar7 = vminps_avx(auVar147,auVar7);
              auVar15 = vshufpd_avx(auVar7,auVar7,5);
              auVar7 = vminps_avx(auVar7,auVar15);
              auVar15 = vpermpd_avx2(auVar7,0x4e);
              auVar7 = vminps_avx(auVar7,auVar15);
              auVar7 = vcmpps_avx(auVar147,auVar7,0);
              auVar15 = auVar114 & auVar7;
              auVar147 = auVar114;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar147 = vandps_avx(auVar7,auVar114);
              }
              uVar86 = vmovmskps_avx(auVar147);
              iVar24 = 0;
              for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar87 = iVar24 << 2;
              local_900 = auVar114;
              *(undefined4 *)(local_900 + uVar87) = 0;
              uVar86 = *(uint *)(local_1c0 + uVar87);
              uVar87 = *(uint *)(local_3a0 + uVar87);
              fVar201 = auVar6._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar201 = sqrtf((float)local_9c0._0_4_);
              }
              local_9e0._0_4_ = fVar201 * 1.9073486e-06;
              auVar10 = vinsertps_avx(ZEXT416(uVar87),ZEXT416(uVar86),0x10);
              auVar265 = ZEXT1664(auVar10);
              bVar94 = true;
              uVar90 = 0;
              do {
                auVar134 = auVar265._0_16_;
                auVar100 = vmovshdup_avx(auVar134);
                fVar216 = auVar100._0_4_;
                fVar217 = 1.0 - fVar216;
                fVar221 = fVar217 * fVar217 * fVar217;
                fVar218 = fVar216 * fVar216 * fVar216;
                auVar153 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar221),
                                           ZEXT416((uint)fVar218));
                fVar201 = fVar216 * fVar217;
                auVar108 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar217 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar103 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar216 * fVar201)));
                auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                          ZEXT416((uint)fVar221));
                fVar215 = (auVar10._0_4_ + auVar103._0_4_) * 0.16666667;
                fVar218 = fVar218 * 0.16666667;
                auVar138._0_4_ = fVar218 * fVar126;
                auVar138._4_4_ = fVar218 * fStack_b3c;
                auVar138._8_4_ = fVar218 * fStack_b38;
                auVar138._12_4_ = fVar218 * fStack_b34;
                auVar188._4_4_ = fVar215;
                auVar188._0_4_ = fVar215;
                auVar188._8_4_ = fVar215;
                auVar188._12_4_ = fVar215;
                auVar10 = vfmadd132ps_fma(auVar188,auVar138,auVar8);
                fVar215 = (auVar153._0_4_ + auVar108._0_4_) * 0.16666667;
                auVar139._4_4_ = fVar215;
                auVar139._0_4_ = fVar215;
                auVar139._8_4_ = fVar215;
                auVar139._12_4_ = fVar215;
                auVar10 = vfmadd132ps_fma(auVar139,auVar10,auVar101);
                fVar218 = auVar265._0_4_;
                auVar162._4_4_ = fVar218;
                auVar162._0_4_ = fVar218;
                auVar162._8_4_ = fVar218;
                auVar162._12_4_ = fVar218;
                auVar153 = vfmadd213ps_fma(auVar162,local_9b0,_DAT_01f7aa10);
                fVar221 = fVar221 * 0.16666667;
                auVar107._4_4_ = fVar221;
                auVar107._0_4_ = fVar221;
                auVar107._8_4_ = fVar221;
                auVar107._12_4_ = fVar221;
                auVar10 = vfmadd132ps_fma(auVar107,auVar10,auVar11);
                local_7a0._0_16_ = auVar10;
                auVar153 = vsubps_avx(auVar153,auVar10);
                auVar10 = vdpps_avx(auVar153,auVar153,0x7f);
                fVar215 = auVar10._0_4_;
                if (fVar215 < 0.0) {
                  local_a00._0_4_ = fVar201;
                  auVar265._0_4_ = sqrtf(fVar215);
                  auVar265._4_60_ = extraout_var_00;
                  auVar108 = auVar265._0_16_;
                  fVar201 = (float)local_a00._0_4_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar10,auVar10);
                }
                auVar99 = ZEXT416((uint)fVar217);
                auVar109._4_4_ = fVar217;
                auVar109._0_4_ = fVar217;
                auVar109._8_4_ = fVar217;
                auVar109._12_4_ = fVar217;
                auVar165 = vfnmsub213ss_fma(auVar100,auVar100,ZEXT416((uint)(fVar201 * 4.0)));
                auVar103 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),auVar99,auVar99);
                fVar201 = fVar217 * -fVar217 * 0.5;
                fVar221 = auVar165._0_4_ * 0.5;
                fVar217 = auVar103._0_4_ * 0.5;
                fVar216 = fVar216 * fVar216 * 0.5;
                auVar230._0_4_ = fVar126 * fVar216;
                auVar230._4_4_ = fStack_b3c * fVar216;
                auVar230._8_4_ = fStack_b38 * fVar216;
                auVar230._12_4_ = fStack_b34 * fVar216;
                auVar189._4_4_ = fVar217;
                auVar189._0_4_ = fVar217;
                auVar189._8_4_ = fVar217;
                auVar189._12_4_ = fVar217;
                auVar103 = vfmadd213ps_fma(auVar189,auVar8,auVar230);
                auVar207._4_4_ = fVar221;
                auVar207._0_4_ = fVar221;
                auVar207._8_4_ = fVar221;
                auVar207._12_4_ = fVar221;
                auVar103 = vfmadd213ps_fma(auVar207,auVar101,auVar103);
                auVar275._4_4_ = fVar201;
                auVar275._0_4_ = fVar201;
                auVar275._8_4_ = fVar201;
                auVar275._12_4_ = fVar201;
                auVar202 = vfmadd213ps_fma(auVar275,auVar11,auVar103);
                auVar103 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar99,auVar100);
                auVar165 = vfmadd213ss_fma(auVar100,SUB6416(ZEXT464(0xc0000000),0),auVar99);
                auVar100 = vshufps_avx(auVar134,auVar134,0x55);
                auVar190._0_4_ = fVar126 * auVar100._0_4_;
                auVar190._4_4_ = fStack_b3c * auVar100._4_4_;
                auVar190._8_4_ = fStack_b38 * auVar100._8_4_;
                auVar190._12_4_ = fStack_b34 * auVar100._12_4_;
                uVar97 = auVar165._0_4_;
                auVar208._4_4_ = uVar97;
                auVar208._0_4_ = uVar97;
                auVar208._8_4_ = uVar97;
                auVar208._12_4_ = uVar97;
                auVar100 = vfmadd213ps_fma(auVar208,auVar8,auVar190);
                auVar163._0_4_ = auVar103._0_4_;
                auVar163._4_4_ = auVar163._0_4_;
                auVar163._8_4_ = auVar163._0_4_;
                auVar163._12_4_ = auVar163._0_4_;
                auVar100 = vfmadd213ps_fma(auVar163,auVar101,auVar100);
                auVar99 = vfmadd231ps_fma(auVar100,auVar11,auVar109);
                auVar103 = vdpps_avx(auVar202,auVar202,0x7f);
                auVar100 = vblendps_avx(auVar103,_DAT_01f7aa10,0xe);
                auVar165 = vrsqrtss_avx(auVar100,auVar100);
                fVar201 = auVar165._0_4_;
                fVar217 = auVar103._0_4_;
                fVar201 = fVar201 * 1.5 + fVar217 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar165 = vdpps_avx(auVar202,auVar99,0x7f);
                auVar164._0_4_ = auVar99._0_4_ * fVar217;
                auVar164._4_4_ = auVar99._4_4_ * fVar217;
                auVar164._8_4_ = auVar99._8_4_ * fVar217;
                auVar164._12_4_ = auVar99._12_4_ * fVar217;
                fVar221 = auVar165._0_4_;
                auVar231._0_4_ = auVar202._0_4_ * fVar221;
                auVar231._4_4_ = auVar202._4_4_ * fVar221;
                fVar216 = auVar202._8_4_;
                auVar231._8_4_ = fVar216 * fVar221;
                fVar260 = auVar202._12_4_;
                auVar231._12_4_ = fVar260 * fVar221;
                auVar165 = vsubps_avx(auVar164,auVar231);
                auVar100 = vrcpss_avx(auVar100,auVar100);
                auVar99 = vfnmadd213ss_fma(auVar100,auVar103,ZEXT416(0x40000000));
                fVar221 = auVar100._0_4_ * auVar99._0_4_;
                auVar100 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar218 * (float)local_9e0._0_4_)));
                auVar178 = ZEXT1664(auVar100);
                auVar241._0_8_ = auVar202._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = -fVar216;
                auVar241._12_4_ = -fVar260;
                auVar191._0_4_ = fVar201 * auVar165._0_4_ * fVar221;
                auVar191._4_4_ = fVar201 * auVar165._4_4_ * fVar221;
                auVar191._8_4_ = fVar201 * auVar165._8_4_ * fVar221;
                auVar191._12_4_ = fVar201 * auVar165._12_4_ * fVar221;
                auVar263._0_4_ = auVar202._0_4_ * fVar201;
                auVar263._4_4_ = auVar202._4_4_ * fVar201;
                auVar263._8_4_ = fVar216 * fVar201;
                auVar263._12_4_ = fVar260 * fVar201;
                if (fVar217 < -fVar217) {
                  local_a00._0_16_ = auVar241;
                  local_a40._0_16_ = auVar263;
                  local_a20._0_16_ = auVar191;
                  fVar201 = sqrtf(fVar217);
                  auVar178 = ZEXT464(auVar100._0_4_);
                  auVar108 = ZEXT416(auVar108._0_4_);
                  auVar191 = local_a20._0_16_;
                  auVar241 = local_a00._0_16_;
                  auVar263 = local_a40._0_16_;
                }
                else {
                  auVar103 = vsqrtss_avx(auVar103,auVar103);
                  fVar201 = auVar103._0_4_;
                }
                auVar103 = vdpps_avx(auVar153,auVar263,0x7f);
                auVar157 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar108,auVar178._0_16_);
                auVar165 = vdpps_avx(auVar241,auVar263,0x7f);
                auVar99 = vdpps_avx(auVar153,auVar191,0x7f);
                auVar133 = vdpps_avx(local_9b0,auVar263,0x7f);
                auVar157 = vfmadd213ss_fma(ZEXT416((uint)(auVar108._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_960._0_4_ / fVar201)),
                                           auVar157);
                auVar282 = ZEXT1664(auVar157);
                fVar201 = auVar165._0_4_ + auVar99._0_4_;
                auVar287 = ZEXT464((uint)fVar201);
                fVar221 = auVar103._0_4_;
                auVar110._0_4_ = fVar221 * fVar221;
                auVar110._4_4_ = auVar103._4_4_ * auVar103._4_4_;
                auVar110._8_4_ = auVar103._8_4_ * auVar103._8_4_;
                auVar110._12_4_ = auVar103._12_4_ * auVar103._12_4_;
                auVar108 = vdpps_avx(auVar153,auVar241,0x7f);
                auVar99 = vsubps_avx(auVar10,auVar110);
                auVar165 = vrsqrtss_avx(auVar99,auVar99);
                fVar217 = auVar99._0_4_;
                fVar218 = auVar165._0_4_;
                fVar218 = fVar218 * 1.5 + fVar217 * -0.5 * fVar218 * fVar218 * fVar218;
                auVar165 = vdpps_avx(auVar153,local_9b0,0x7f);
                auVar108 = vfnmadd231ss_fma(auVar108,auVar103,ZEXT416((uint)fVar201));
                auVar165 = vfnmadd231ss_fma(auVar165,auVar103,auVar133);
                if (fVar217 < 0.0) {
                  local_a00._0_4_ = auVar157._0_4_;
                  local_a40._0_16_ = ZEXT416((uint)fVar201);
                  local_a20._0_16_ = auVar133;
                  local_940._0_16_ = auVar108;
                  local_7c0._0_4_ = fVar218;
                  local_7e0._0_16_ = auVar165;
                  fVar201 = sqrtf(fVar217);
                  auVar287 = ZEXT1664(local_a40._0_16_);
                  auVar282 = ZEXT464((uint)local_a00._0_4_);
                  auVar178 = ZEXT464(auVar100._0_4_);
                  fVar218 = (float)local_7c0._0_4_;
                  auVar165 = local_7e0._0_16_;
                  auVar133 = local_a20._0_16_;
                  auVar108 = local_940._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar99,auVar99);
                  fVar201 = auVar100._0_4_;
                }
                auVar276 = ZEXT1664(auVar103);
                auVar245 = ZEXT1664(auVar202);
                auVar100 = vpermilps_avx(local_7a0._0_16_,0xff);
                fVar201 = fVar201 - auVar100._0_4_;
                auVar99 = vshufps_avx(auVar202,auVar202,0xff);
                auVar100 = vfmsub213ss_fma(auVar108,ZEXT416((uint)fVar218),auVar99);
                auVar192._0_8_ = auVar133._0_8_ ^ 0x8000000080000000;
                auVar192._8_4_ = auVar133._8_4_ ^ 0x80000000;
                auVar192._12_4_ = auVar133._12_4_ ^ 0x80000000;
                auVar209._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
                auVar209._8_4_ = auVar100._8_4_ ^ 0x80000000;
                auVar209._12_4_ = auVar100._12_4_ ^ 0x80000000;
                auVar165 = ZEXT416((uint)(auVar165._0_4_ * fVar218));
                auVar157 = auVar287._0_16_;
                auVar108 = vfmsub231ss_fma(ZEXT416((uint)(auVar133._0_4_ * auVar100._0_4_)),auVar157
                                           ,auVar165);
                auVar100 = vinsertps_avx(auVar209,auVar165,0x1c);
                uVar97 = auVar108._0_4_;
                auVar210._4_4_ = uVar97;
                auVar210._0_4_ = uVar97;
                auVar210._8_4_ = uVar97;
                auVar210._12_4_ = uVar97;
                auVar100 = vdivps_avx(auVar100,auVar210);
                auVar108 = vinsertps_avx(auVar157,auVar192,0x10);
                auVar108 = vdivps_avx(auVar108,auVar210);
                auVar166._0_4_ = fVar221 * auVar100._0_4_ + fVar201 * auVar108._0_4_;
                auVar166._4_4_ = fVar221 * auVar100._4_4_ + fVar201 * auVar108._4_4_;
                auVar166._8_4_ = fVar221 * auVar100._8_4_ + fVar201 * auVar108._8_4_;
                auVar166._12_4_ = fVar221 * auVar100._12_4_ + fVar201 * auVar108._12_4_;
                auVar108 = vsubps_avx(auVar134,auVar166);
                auVar265 = ZEXT1664(auVar108);
                auVar100 = vandps_avx(auVar103,auVar238);
                if (auVar100._0_4_ < auVar282._0_4_) {
                  auVar134 = vfmadd231ss_fma(ZEXT416((uint)(auVar178._0_4_ + auVar282._0_4_)),
                                             local_800._0_16_,ZEXT416(0x36000000));
                  auVar100 = vandps_avx(ZEXT416((uint)fVar201),auVar238);
                  if (auVar100._0_4_ < auVar134._0_4_) {
                    fVar201 = auVar108._0_4_ + (float)local_8e0._0_4_;
                    if (fVar201 < fVar96) {
                      bVar95 = 0;
                    }
                    else {
                      fVar218 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar218 < fVar201) {
                        bVar95 = 0;
                      }
                      else {
                        auVar100 = vmovshdup_avx(auVar108);
                        bVar95 = 0;
                        if ((0.0 <= auVar100._0_4_) && (auVar100._0_4_ <= 1.0)) {
                          auVar10 = vrsqrtss_avx(auVar10,auVar10);
                          fVar221 = auVar10._0_4_;
                          pGVar3 = (context->scene->geometries).items[uVar88].ptr;
                          if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar95 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar95 = 1, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar215 = fVar221 * 1.5 + fVar215 * -0.5 * fVar221 * fVar221 * fVar221;
                            local_ac0 = auVar153._0_4_;
                            fStack_abc = auVar153._4_4_;
                            fStack_ab8 = auVar153._8_4_;
                            fStack_ab4 = auVar153._12_4_;
                            auVar167._0_4_ = fVar215 * local_ac0;
                            auVar167._4_4_ = fVar215 * fStack_abc;
                            auVar167._8_4_ = fVar215 * fStack_ab8;
                            auVar167._12_4_ = fVar215 * fStack_ab4;
                            auVar134 = vfmadd213ps_fma(auVar99,auVar167,auVar202);
                            auVar10 = vshufps_avx(auVar167,auVar167,0xc9);
                            auVar100 = vshufps_avx(auVar202,auVar202,0xc9);
                            auVar168._0_4_ = auVar167._0_4_ * auVar100._0_4_;
                            auVar168._4_4_ = auVar167._4_4_ * auVar100._4_4_;
                            auVar168._8_4_ = auVar167._8_4_ * auVar100._8_4_;
                            auVar168._12_4_ = auVar167._12_4_ * auVar100._12_4_;
                            auVar153 = vfmsub231ps_fma(auVar168,auVar202,auVar10);
                            auVar10 = vshufps_avx(auVar153,auVar153,0xc9);
                            auVar100 = vshufps_avx(auVar134,auVar134,0xc9);
                            auVar153 = vshufps_avx(auVar153,auVar153,0xd2);
                            auVar111._0_4_ = auVar134._0_4_ * auVar153._0_4_;
                            auVar111._4_4_ = auVar134._4_4_ * auVar153._4_4_;
                            auVar111._8_4_ = auVar134._8_4_ * auVar153._8_4_;
                            auVar111._12_4_ = auVar134._12_4_ * auVar153._12_4_;
                            auVar10 = vfmsub231ps_fma(auVar111,auVar10,auVar100);
                            local_730 = vshufps_avx(auVar108,auVar108,0x55);
                            local_760 = (RTCHitN  [16])vshufps_avx(auVar10,auVar10,0x55);
                            auStack_750 = vshufps_avx(auVar10,auVar10,0xaa);
                            local_740 = auVar10._0_4_;
                            local_720 = ZEXT416(0) << 0x20;
                            local_710 = CONCAT44(uStack_77c,local_780);
                            uStack_708 = CONCAT44(uStack_774,uStack_778);
                            local_700._4_4_ = uStack_76c;
                            local_700._0_4_ = local_770;
                            local_700._8_4_ = uStack_768;
                            local_700._12_4_ = uStack_764;
                            vpcmpeqd_avx2(ZEXT1632(local_700),ZEXT1632(local_700));
                            uStack_6ec = context->user->instID[0];
                            local_6f0 = uStack_6ec;
                            uStack_6e8 = uStack_6ec;
                            uStack_6e4 = uStack_6ec;
                            uStack_6e0 = context->user->instPrimID[0];
                            uStack_6dc = uStack_6e0;
                            uStack_6d8 = uStack_6e0;
                            uStack_6d4 = uStack_6e0;
                            *(float *)(ray + k * 4 + 0x80) = fVar201;
                            local_8d0 = *(undefined1 (*) [16])
                                         (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_a90.valid = (int *)local_8d0;
                            local_a90.geometryUserPtr = pGVar3->userPtr;
                            local_a90.context = context->user;
                            local_a90.hit = local_760;
                            local_a90.N = 4;
                            local_a90.ray = (RTCRayN *)ray;
                            uStack_73c = local_740;
                            uStack_738 = local_740;
                            uStack_734 = local_740;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar245 = ZEXT1664(auVar202);
                              auVar265 = ZEXT1664(auVar108);
                              auVar276 = ZEXT1664(auVar103);
                              auVar282 = ZEXT1664(auVar282._0_16_);
                              auVar287 = ZEXT1664(auVar157);
                              (*pGVar3->occlusionFilterN)(&local_a90);
                            }
                            if (local_8d0 == (undefined1  [16])0x0) {
                              auVar10 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar10 = auVar10 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar245 = ZEXT1664(auVar245._0_16_);
                                auVar265 = ZEXT1664(auVar265._0_16_);
                                auVar276 = ZEXT1664(auVar276._0_16_);
                                auVar282 = ZEXT1664(auVar282._0_16_);
                                auVar287 = ZEXT1664(auVar287._0_16_);
                                (*p_Var4)(&local_a90);
                              }
                              auVar100 = vpcmpeqd_avx(local_8d0,_DAT_01f7aa10);
                              auVar10 = auVar100 ^ _DAT_01f7ae20;
                              auVar169._8_4_ = 0xff800000;
                              auVar169._0_8_ = 0xff800000ff800000;
                              auVar169._12_4_ = 0xff800000;
                              auVar100 = vblendvps_avx(auVar169,*(undefined1 (*) [16])
                                                                 (local_a90.ray + 0x80),auVar100);
                              *(undefined1 (*) [16])(local_a90.ray + 0x80) = auVar100;
                            }
                            auVar140._8_8_ = 0x100000001;
                            auVar140._0_8_ = 0x100000001;
                            bVar95 = (auVar140 & auVar10) != (undefined1  [16])0x0;
                            if (!(bool)bVar95) {
                              *(float *)(ray + k * 4 + 0x80) = fVar218;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_015b94f8;
                  }
                }
                bVar94 = uVar90 < 4;
                uVar90 = uVar90 + 1;
              } while (uVar90 != 5);
              bVar94 = false;
              bVar95 = 5;
LAB_015b94f8:
              bVar91 = (bool)(bVar91 | bVar94 & bVar95);
              uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar120._4_4_ = uVar97;
              auVar120._0_4_ = uVar97;
              auVar120._8_4_ = uVar97;
              auVar120._12_4_ = uVar97;
              auVar120._16_4_ = uVar97;
              auVar120._20_4_ = uVar97;
              auVar120._24_4_ = uVar97;
              auVar120._28_4_ = uVar97;
              auVar147 = vcmpps_avx(_local_840,auVar120,2);
              auVar114 = vandps_avx(auVar147,local_900);
              auVar147 = local_900 & auVar147;
              local_900 = auVar114;
            } while ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar147 >> 0x7f,0) != '\0') ||
                       (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar147 >> 0xbf,0) != '\0') ||
                     (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar147[0x1f] < '\0');
          }
          auVar177._0_4_ = (float)local_920._0_4_ + local_400._0_4_;
          auVar177._4_4_ = (float)local_920._4_4_ + local_400._4_4_;
          auVar177._8_4_ = fStack_918 + local_400._8_4_;
          auVar177._12_4_ = fStack_914 + local_400._12_4_;
          auVar177._16_4_ = fStack_910 + local_400._16_4_;
          auVar177._20_4_ = fStack_90c + local_400._20_4_;
          auVar177._24_4_ = fStack_908 + local_400._24_4_;
          auVar177._28_4_ = fStack_904 + local_400._28_4_;
          auVar147 = vcmpps_avx(auVar177,auVar120,2);
          auVar114 = vandps_avx(local_6c0,local_600);
          auVar114 = vandps_avx(auVar147,auVar114);
          auVar200._0_4_ = (float)local_920._0_4_ + local_3c0._0_4_;
          auVar200._4_4_ = (float)local_920._4_4_ + local_3c0._4_4_;
          auVar200._8_4_ = fStack_918 + local_3c0._8_4_;
          auVar200._12_4_ = fStack_914 + local_3c0._12_4_;
          auVar200._16_4_ = fStack_910 + local_3c0._16_4_;
          auVar200._20_4_ = fStack_90c + local_3c0._20_4_;
          auVar200._24_4_ = fStack_908 + local_3c0._24_4_;
          auVar200._28_4_ = fStack_904 + local_3c0._28_4_;
          auVar7 = vcmpps_avx(auVar200,auVar120,2);
          auVar147 = vandps_avx(local_8a0,local_880);
          auVar147 = vandps_avx(auVar7,auVar147);
          auVar147 = vorps_avx(auVar114,auVar147);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar93 * 0x60) = auVar147;
            auVar114 = vblendvps_avx(local_3c0,local_400,auVar114);
            *(undefined1 (*) [32])(auStack_160 + uVar93 * 0x60) = auVar114;
            uVar1 = vmovlps_avx(local_590);
            (&uStack_140)[uVar93 * 0xc] = uVar1;
            aiStack_138[uVar93 * 0x18] = local_c14 + 1;
            iVar92 = iVar92 + 1;
          }
        }
      }
    }
    if (iVar92 == 0) break;
    uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar123._4_4_ = uVar97;
    auVar123._0_4_ = uVar97;
    auVar123._8_4_ = uVar97;
    auVar123._12_4_ = uVar97;
    auVar123._16_4_ = uVar97;
    auVar123._20_4_ = uVar97;
    auVar123._24_4_ = uVar97;
    auVar123._28_4_ = uVar97;
    uVar86 = -iVar92;
    pauVar85 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar92 - 1) * 0x60);
    fVar201 = (float)local_920._0_4_;
    fVar215 = (float)local_920._4_4_;
    fVar218 = fStack_918;
    fVar221 = fStack_914;
    fVar217 = fStack_910;
    fVar216 = fStack_90c;
    fVar260 = fStack_908;
    fVar220 = fStack_904;
    while( true ) {
      auVar114 = pauVar85[1];
      auVar148._0_4_ = fVar201 + auVar114._0_4_;
      auVar148._4_4_ = fVar215 + auVar114._4_4_;
      auVar148._8_4_ = fVar218 + auVar114._8_4_;
      auVar148._12_4_ = fVar221 + auVar114._12_4_;
      auVar148._16_4_ = fVar217 + auVar114._16_4_;
      auVar148._20_4_ = fVar216 + auVar114._20_4_;
      auVar148._24_4_ = fVar260 + auVar114._24_4_;
      auVar148._28_4_ = fVar220 + auVar114._28_4_;
      auVar147 = vcmpps_avx(auVar148,auVar123,2);
      _local_760 = vandps_avx(auVar147,*pauVar85);
      auVar147 = *pauVar85 & auVar147;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar147 >> 0x7f,0) != '\0') ||
            (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar147 >> 0xbf,0) != '\0') ||
          (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar147[0x1f] < '\0') break;
      pauVar85 = pauVar85 + -3;
      uVar86 = uVar86 + 1;
      fVar201 = (float)local_920._0_4_;
      fVar215 = (float)local_920._4_4_;
      fVar218 = fStack_918;
      fVar221 = fStack_914;
      fVar217 = fStack_910;
      fVar216 = fStack_90c;
      fVar260 = fStack_908;
      fVar220 = fStack_904;
      if (uVar86 == 0) goto LAB_015b9ae3;
    }
    auVar124._8_4_ = 0x7f800000;
    auVar124._0_8_ = 0x7f8000007f800000;
    auVar124._12_4_ = 0x7f800000;
    auVar124._16_4_ = 0x7f800000;
    auVar124._20_4_ = 0x7f800000;
    auVar124._24_4_ = 0x7f800000;
    auVar124._28_4_ = 0x7f800000;
    auVar114 = vblendvps_avx(auVar124,auVar114,_local_760);
    auVar147 = vshufps_avx(auVar114,auVar114,0xb1);
    auVar147 = vminps_avx(auVar114,auVar147);
    auVar7 = vshufpd_avx(auVar147,auVar147,5);
    auVar147 = vminps_avx(auVar147,auVar7);
    auVar7 = vpermpd_avx2(auVar147,0x4e);
    auVar147 = vminps_avx(auVar147,auVar7);
    auVar147 = vcmpps_avx(auVar114,auVar147,0);
    auVar7 = _local_760 & auVar147;
    auVar114 = _local_760;
    if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar7 >> 0x7f,0) != '\0') ||
          (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar7 >> 0xbf,0) != '\0') ||
        (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar7[0x1f] < '\0') {
      auVar114 = vandps_avx(auVar147,_local_760);
    }
    uVar90 = *(ulong *)pauVar85[2];
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar90;
    uVar87 = vmovmskps_avx(auVar114);
    iVar92 = 0;
    for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
      iVar92 = iVar92 + 1;
    }
    *(undefined4 *)(local_760 + (uint)(iVar92 << 2)) = 0;
    uVar87 = ~uVar86;
    if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_760 >> 0x7f,0) != '\0') ||
          (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_760 >> 0xbf,0) != '\0') ||
        (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_760[0x1f] < '\0') {
      uVar87 = -uVar86;
    }
    uVar93 = (ulong)uVar87;
    local_c14 = *(int *)(pauVar85[2] + 8);
    *pauVar85 = _local_760;
    uVar97 = (undefined4)uVar90;
    auVar149._4_4_ = uVar97;
    auVar149._0_4_ = uVar97;
    auVar149._8_4_ = uVar97;
    auVar149._12_4_ = uVar97;
    auVar149._16_4_ = uVar97;
    auVar149._20_4_ = uVar97;
    auVar149._24_4_ = uVar97;
    auVar149._28_4_ = uVar97;
    auVar10 = vmovshdup_avx(auVar112);
    auVar10 = vsubps_avx(auVar10,auVar112);
    auVar125._0_4_ = auVar10._0_4_;
    auVar125._4_4_ = auVar125._0_4_;
    auVar125._8_4_ = auVar125._0_4_;
    auVar125._12_4_ = auVar125._0_4_;
    auVar125._16_4_ = auVar125._0_4_;
    auVar125._20_4_ = auVar125._0_4_;
    auVar125._24_4_ = auVar125._0_4_;
    auVar125._28_4_ = auVar125._0_4_;
    auVar10 = vfmadd132ps_fma(auVar125,auVar149,_DAT_01faff20);
    local_400 = ZEXT1632(auVar10);
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_400 + (uint)(iVar92 << 2));
  } while( true );
LAB_015b9ae3:
  if (bVar91 != false) {
    return bVar91;
  }
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar113._4_4_ = uVar97;
  auVar113._0_4_ = uVar97;
  auVar113._8_4_ = uVar97;
  auVar113._12_4_ = uVar97;
  auVar5 = vcmpps_avx(local_5a0,auVar113,2);
  uVar88 = vmovmskps_avx(auVar5);
  uVar88 = (uint)local_8a8 & uVar88;
  if (uVar88 == 0) {
    return false;
  }
  goto LAB_015b7346;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }